

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void reverse_sequence_iterator_kvs_test(void)

{
  fdb_encryption_key *pfVar1;
  bool *pbVar2;
  fdb_kvs_handle *pfVar3;
  fdb_status fVar4;
  int iVar5;
  fdb_kvs_handle *pfVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  __atomic_base<unsigned_long> _Var10;
  __atomic_base<unsigned_long> doc;
  fdb_iterator **ppfVar11;
  fdb_file_handle **ptr_fhandle;
  btree *pbVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle **ppfVar14;
  fdb_doc *pfVar15;
  fdb_doc *pfVar16;
  fdb_kvs_handle **ptr_iterator;
  fdb_config **ptr_iterator_00;
  fdb_config *pfVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  fdb_kvs_handle **unaff_RBP;
  fdb_doc **doc_00;
  char *pcVar21;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R12;
  long lVar22;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar23;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar24;
  fdb_kvs_handle **unaff_R13;
  fdb_doc *doc_01;
  __atomic_base<unsigned_long> _Var25;
  fdb_config *pfVar26;
  char *doc_02;
  ulong uVar27;
  bool bVar28;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_iterator *iterator2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv2;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_5050;
  fdb_kvs_handle *pfStack_5048;
  fdb_file_handle *pfStack_5040;
  fdb_doc *pfStack_5038;
  fdb_kvs_config fStack_5030;
  timeval tStack_5018;
  fdb_config fStack_5008;
  fdb_config *pfStack_4f10;
  fdb_iterator *pfStack_4ef8;
  fdb_kvs_handle *pfStack_4ef0;
  fdb_doc *pfStack_4ee8;
  fdb_file_handle *pfStack_4ee0;
  fdb_kvs_config fStack_4ed8;
  timeval tStack_4ec0;
  fdb_config fStack_4eb0;
  fdb_config *pfStack_4db8;
  fdb_iterator *pfStack_4da0;
  fdb_kvs_handle *pfStack_4d98;
  fdb_file_handle *pfStack_4d90;
  fdb_doc *pfStack_4d88;
  uint64_t uStack_4d80;
  undefined1 uStack_4d78;
  undefined7 uStack_4d70;
  undefined4 uStack_4d69;
  undefined8 uStack_4d60;
  undefined7 uStack_4d58;
  undefined4 uStack_4d51;
  fdb_kvs_config fStack_4d48;
  timeval tStack_4d30;
  undefined4 uStack_4d20;
  undefined1 uStack_4d1c;
  fdb_config fStack_4c18;
  char acStack_4b20 [256];
  fdb_config *pfStack_4a20;
  char *pcStack_4a18;
  code *pcStack_4a10;
  fdb_doc *pfStack_49f8;
  fdb_iterator *pfStack_49f0;
  fdb_kvs_handle *pfStack_49e8;
  fdb_file_handle *pfStack_49e0;
  fdb_kvs_config fStack_49d8;
  timeval tStack_49c0;
  fdb_config fStack_49b0;
  fdb_iterator **ppfStack_48b8;
  fdb_iterator *pfStack_48a0;
  fdb_doc *pfStack_4898;
  fdb_kvs_handle *pfStack_4890;
  fdb_file_handle *pfStack_4888;
  timeval tStack_4880;
  fdb_iterator *apfStack_4870 [33];
  fdb_kvs_config fStack_4768;
  char acStack_4750 [264];
  fdb_config fStack_4648;
  char acStack_4550 [256];
  fdb_kvs_handle *pfStack_4450;
  fdb_kvs_handle *pfStack_4448;
  fdb_doc **ppfStack_4440;
  fdb_doc **ppfStack_4438;
  fdb_doc **ppfStack_4430;
  fdb_kvs_handle *pfStack_4418;
  fdb_file_handle *pfStack_4410;
  fdb_iterator *pfStack_4408;
  fdb_doc *pfStack_4400;
  fdb_kvs_handle *pfStack_43f8;
  fdb_kvs_config fStack_43f0;
  timeval tStack_43d8;
  fdb_doc *apfStack_43c8 [32];
  undefined1 auStack_42c8 [272];
  uint8_t auStack_41b8 [20];
  undefined4 uStack_41a4;
  undefined4 uStack_419c;
  undefined1 uStack_4192;
  fdb_doc *apfStack_40c8 [500];
  fdb_kvs_handle afStack_3128 [7];
  fdb_kvs_handle **ppfStack_2180;
  fdb_kvs_handle *pfStack_2178;
  fdb_doc **ppfStack_2168;
  fdb_doc **ppfStack_2160;
  fdb_doc **ppfStack_2158;
  fdb_kvs_handle *pfStack_2148;
  fdb_iterator *pfStack_2140;
  fdb_iterator *pfStack_2138;
  fdb_kvs_handle *pfStack_2130;
  fdb_file_handle *pfStack_2128;
  fdb_doc *pfStack_2120;
  fdb_file_handle *pfStack_2118;
  undefined1 auStack_2110 [56];
  fdb_config fStack_20d8;
  fdb_doc *apfStack_1fe0 [65];
  fdb_config **ppfStack_1dd8;
  btree *pbStack_1dd0;
  fdb_kvs_handle **ppfStack_1dc8;
  fdb_config *pfStack_1dc0;
  fdb_file_handle **ppfStack_1db8;
  fdb_kvs_handle *pfStack_1db0;
  fdb_config *pfStack_1da0;
  fdb_config *pfStack_1d98;
  fdb_kvs_handle *pfStack_1d90;
  fdb_file_handle *pfStack_1d88;
  fdb_kvs_config fStack_1d80;
  fdb_doc *apfStack_1d68 [5];
  fdb_kvs_handle *apfStack_1d40 [5];
  timeval tStack_1d18;
  fdb_kvs_handle fStack_1d08;
  fdb_config fStack_1a08;
  fdb_kvs_handle **ppfStack_1910;
  btree *pbStack_1908;
  fdb_kvs_handle **ppfStack_1900;
  undefined8 *puStack_18f8;
  undefined7 *puStack_18f0;
  fdb_kvs_handle *pfStack_18e8;
  fdb_kvs_handle *pfStack_18d8;
  fdb_kvs_handle *pfStack_18d0;
  fdb_kvs_handle *pfStack_18c8;
  undefined7 uStack_18c0;
  undefined4 uStack_18b9;
  fdb_kvs_handle *pfStack_18b0;
  fdb_file_handle *pfStack_18a8;
  undefined1 auStack_18a0 [16];
  undefined7 uStack_1890;
  undefined1 uStack_1889;
  undefined7 uStack_1888;
  undefined8 uStack_1880;
  void *pvStack_1878;
  undefined1 uStack_1870;
  timeval tStack_1868;
  undefined1 auStack_1858 [40];
  fdb_file_handle *pfStack_1830;
  undefined4 uStack_181c;
  fdb_iterator **ppfStack_1748;
  char *pcStack_1740;
  fdb_kvs_handle *pfStack_1738;
  char *pcStack_1730;
  char *pcStack_1728;
  code *pcStack_1720;
  fdb_iterator *pfStack_1710;
  fdb_iterator *pfStack_1708;
  fdb_kvs_handle *pfStack_1700;
  fdb_kvs_handle *pfStack_16f8;
  fdb_file_handle *pfStack_16f0;
  timeval tStack_16e8;
  fdb_kvs_config fStack_16d8;
  fdb_config fStack_16c0;
  char acStack_15c8 [256];
  char acStack_14c8 [264];
  fdb_kvs_handle *pfStack_13c0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_13b8;
  fdb_kvs_handle **ppfStack_13b0;
  fdb_kvs_handle *pfStack_13a8;
  fdb_kvs_handle *pfStack_13a0;
  fdb_kvs_handle **ppfStack_1398;
  undefined1 auStack_1388 [16];
  fdb_kvs_handle *pfStack_1378;
  fdb_file_handle *pfStack_1370;
  fdb_kvs_handle *pfStack_1368;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1360 [11];
  undefined1 auStack_1308 [40];
  fdb_kvs_handle fStack_12e0;
  fdb_config fStack_fe0;
  fdb_config *pfStack_ee8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_ee0;
  fdb_kvs_handle **ppfStack_ed8;
  fdb_doc *pfStack_ed0;
  fdb_file_handle **ppfStack_ec8;
  fdb_kvs_handle **ppfStack_ec0;
  undefined1 auStack_ea8 [24];
  fdb_file_handle *pfStack_e90;
  undefined1 auStack_e88 [48];
  timeval tStack_e58;
  fdb_doc *apfStack_e48 [24];
  long lStack_d88;
  long lStack_d58;
  fdb_config fStack_b28;
  fdb_doc *pfStack_a30;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_a28;
  fdb_doc *pfStack_a20;
  fdb_file_handle **ppfStack_a18;
  undefined1 auStack_a00 [24];
  fdb_file_handle *pfStack_9e8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_9e0 [11];
  timeval tStack_988;
  fdb_doc afStack_978 [3];
  char acStack_860 [256];
  char acStack_760 [256];
  fdb_config fStack_660;
  fdb_kvs_handle **ppfStack_568;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_560;
  fdb_kvs_handle **ppfStack_558;
  fdb_kvs_handle *pfStack_550;
  btree *pbStack_548;
  fdb_kvs_handle **ppfStack_540;
  undefined1 local_528 [40];
  fdb_kvs_handle *local_500;
  fdb_kvs_handle *local_4f8 [11];
  undefined1 local_4a0 [40];
  btree bStack_478;
  fdb_kvs_handle *local_430;
  undefined1 local_428 [256];
  fdb_kvs_handle *local_328 [32];
  char local_228 [256];
  fdb_config local_128;
  
  ppfStack_540 = (fdb_kvs_handle **)0x118218;
  gettimeofday((timeval *)(local_4a0 + 0x18),(__timezone_ptr_t)0x0);
  ppfStack_540 = (fdb_kvs_handle **)0x11821d;
  memleak_start();
  local_528._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_540 = (fdb_kvs_handle **)0x11822e;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_540 = (fdb_kvs_handle **)0x11823e;
  fdb_get_default_config();
  pfVar6 = (fdb_kvs_handle *)local_4a0;
  ppfStack_540 = (fdb_kvs_handle **)0x11824e;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.seqtree_opt = 1;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = 0;
  pbVar12 = (btree *)(local_528 + 0x20);
  ppfStack_540 = (fdb_kvs_handle **)0x118280;
  fdb_open((fdb_file_handle **)pbVar12,"./iterator_test1",(fdb_config *)((long)local_328 + 0x200));
  ppfVar14 = (fdb_kvs_handle **)(local_528 + 0x18);
  ppfStack_540 = (fdb_kvs_handle **)0x118293;
  fdb_kvs_open_default((fdb_file_handle *)local_528._32_8_,ppfVar14,(fdb_kvs_config *)pfVar6);
  ppfStack_540 = (fdb_kvs_handle **)0x1182a9;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_528._24_8_,logCallbackFunc,
                     "reverse_sequence_iterator_kvs_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_540 = (fdb_kvs_handle **)0x1182cf;
    fVar4 = fdb_kvs_open((fdb_file_handle *)local_528._32_8_,&local_500,"kv2",
                         (fdb_kvs_config *)local_4a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a7f;
    unaff_R12.end_seqnum = 0;
    ppfVar14 = (fdb_kvs_handle **)0x0;
    do {
      ppfStack_540 = (fdb_kvs_handle **)0x1182f7;
      sprintf((char *)((long)local_328 + 0x100U),"kEy%d",(ulong)ppfVar14 & 0xffffffff);
      ppfStack_540 = (fdb_kvs_handle **)0x11830f;
      sprintf((char *)local_328,"mEta%d",(ulong)ppfVar14 & 0xffffffff);
      ppfStack_540 = (fdb_kvs_handle **)0x118327;
      sprintf(local_428,"bOdy%d",(ulong)ppfVar14 & 0xffffffff);
      pbVar12 = (btree *)((long)&bStack_478 + unaff_R12.end_seqnum);
      ppfStack_540 = (fdb_kvs_handle **)0x11833a;
      unaff_R13 = (fdb_kvs_handle **)strlen((char *)((long)local_328 + 0x100U));
      unaff_RBP = local_328;
      ppfStack_540 = (fdb_kvs_handle **)0x11834d;
      pfVar6 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      ppfStack_540 = (fdb_kvs_handle **)0x11835d;
      sVar7 = strlen(local_428);
      ppfStack_540 = (fdb_kvs_handle **)0x118382;
      fdb_doc_create((fdb_doc **)pbVar12,(undefined1 *)((long)local_328 + 0x100),(size_t)unaff_R13,
                     unaff_RBP,(size_t)pfVar6,local_428,sVar7);
      ppfStack_540 = (fdb_kvs_handle **)0x118394;
      fVar4 = fdb_set(local_500,*(fdb_doc **)((long)&bStack_478 + (long)ppfVar14 * 8));
      if (fVar4 != FDB_RESULT_SUCCESS) {
        ppfStack_540 = (fdb_kvs_handle **)0x118a3b;
        reverse_sequence_iterator_kvs_test();
        goto LAB_00118a3b;
      }
      ppfVar14 = (fdb_kvs_handle **)((long)ppfVar14 + 1);
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (ppfVar14 != (fdb_kvs_handle **)0xa);
    lVar22 = 0;
    uVar27 = 0;
    do {
      ppfStack_540 = (fdb_kvs_handle **)0x1183cd;
      sprintf((char *)((long)local_328 + 0x100U),"key%d",uVar27 & 0xffffffff);
      ppfStack_540 = (fdb_kvs_handle **)0x1183e5;
      sprintf((char *)local_328,"meta%d",uVar27 & 0xffffffff);
      ppfStack_540 = (fdb_kvs_handle **)0x1183fd;
      sprintf(local_428,"body%d",uVar27 & 0xffffffff);
      ppfStack_540 = (fdb_kvs_handle **)0x11840d;
      sVar7 = strlen((char *)((long)local_328 + 0x100U));
      ppfStack_540 = (fdb_kvs_handle **)0x118420;
      sVar8 = strlen((char *)local_328);
      ppfStack_540 = (fdb_kvs_handle **)0x118430;
      sVar9 = strlen(local_428);
      ppfStack_540 = (fdb_kvs_handle **)0x118455;
      fdb_doc_create((fdb_doc **)((long)local_4f8 + lVar22),(undefined1 *)((long)local_328 + 0x100),
                     sVar7,local_328,sVar8,local_428,sVar9);
      ppfStack_540 = (fdb_kvs_handle **)0x118464;
      fdb_set((fdb_kvs_handle *)local_528._24_8_,*(fdb_doc **)((long)local_4f8 + uVar27 * 8));
      lVar22 = lVar22 + 0x10;
      bVar28 = uVar27 < 8;
      uVar27 = uVar27 + 2;
    } while (bVar28);
    ppfStack_540 = (fdb_kvs_handle **)0x118488;
    fdb_commit((fdb_file_handle *)local_528._32_8_,'\x01');
    unaff_R13 = (fdb_kvs_handle **)0x8;
    uVar27 = 1;
    do {
      ppfStack_540 = (fdb_kvs_handle **)0x1184b0;
      sprintf((char *)((long)local_328 + 0x100U),"key%d",uVar27 & 0xffffffff);
      ppfStack_540 = (fdb_kvs_handle **)0x1184c9;
      sprintf((char *)local_328,"meta%d",uVar27 & 0xffffffff);
      ppfStack_540 = (fdb_kvs_handle **)0x1184e2;
      sprintf(local_428,"body%d",uVar27 & 0xffffffff);
      unaff_R12.end_seqnum = (long)local_4f8 + (long)unaff_R13;
      ppfStack_540 = (fdb_kvs_handle **)0x1184f2;
      unaff_RBP = (fdb_kvs_handle **)strlen((char *)((long)local_328 + 0x100U));
      ppfVar14 = local_328;
      ppfStack_540 = (fdb_kvs_handle **)0x118505;
      sVar7 = strlen((char *)ppfVar14);
      ppfStack_540 = (fdb_kvs_handle **)0x118515;
      sVar8 = strlen(local_428);
      ppfStack_540 = (fdb_kvs_handle **)0x11853a;
      fdb_doc_create((fdb_doc **)unaff_R12,(undefined1 *)((long)local_328 + 0x100),(size_t)unaff_RBP
                     ,ppfVar14,sVar7,local_428,sVar8);
      ppfStack_540 = (fdb_kvs_handle **)0x118549;
      fdb_set((fdb_kvs_handle *)local_528._24_8_,*(fdb_doc **)((long)local_4f8 + uVar27 * 8));
      pfVar6 = (fdb_kvs_handle *)(uVar27 + 2);
      unaff_R13 = unaff_R13 + 2;
      bVar28 = uVar27 < 8;
      uVar27 = (ulong)pfVar6;
    } while (bVar28);
    pbVar12 = (btree *)0x0;
    ppfStack_540 = (fdb_kvs_handle **)0x11856d;
    fdb_commit((fdb_file_handle *)local_528._32_8_,'\0');
    ppfStack_540 = (fdb_kvs_handle **)0x118583;
    fVar4 = fdb_iterator_sequence_init
                      ((fdb_kvs_handle *)local_528._24_8_,(fdb_iterator **)(local_528 + 8),0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a84;
    ppfVar14 = local_4f8;
    pfVar6 = (fdb_kvs_handle *)local_528;
    do {
      ppfStack_540 = (fdb_kvs_handle **)0x1185a2;
      fdb_iterator_get((fdb_iterator *)local_528._8_8_,(fdb_doc **)pfVar6);
      ppfStack_540 = (fdb_kvs_handle **)0x1185ba;
      iVar5 = bcmp(*(kvs_ops_stat **)(local_528._0_8_ + 0x20),(*ppfVar14)->op_stats,
                   *(size_t *)(fdb_kvs_config *)local_528._0_8_);
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x118638;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x1185d7;
      iVar5 = bcmp(*(btree **)(local_528._0_8_ + 0x38),(*ppfVar14)->staletree,
                   (size_t)*(fdb_custom_cmp_variable *)(local_528._0_8_ + 8));
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x118645;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x1185f4;
      iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_528._0_8_ + 0x40))->
                   seqtree,((*ppfVar14)->field_6).seqtree,(size_t)*(void **)(local_528._0_8_ + 0x10)
                  );
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x118652;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x118602;
      fdb_doc_free((fdb_doc *)local_528._0_8_);
      local_528._0_8_ = (fdb_kvs_handle *)0x0;
      if ((int)pbVar12 == 4) {
        pbVar12 = (btree *)0x5;
        break;
      }
      pbVar12 = (btree *)(ulong)((int)pbVar12 + 1);
      ppfStack_540 = (fdb_kvs_handle **)0x11861e;
      fVar4 = fdb_iterator_next((fdb_iterator *)local_528._8_8_);
      ppfVar14 = ppfVar14 + 2;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)pbVar12 != 5) goto LAB_00118a89;
    ppfStack_540 = (fdb_kvs_handle **)0x11867a;
    fVar4 = fdb_iterator_sequence_init(local_500,(fdb_iterator **)(local_528 + 0x10),0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a8e;
    ppfVar14 = (fdb_kvs_handle **)local_528;
    do {
      ppfStack_540 = (fdb_kvs_handle **)0x118694;
      fVar4 = fdb_iterator_get((fdb_iterator *)local_528._16_8_,(fdb_doc **)ppfVar14);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a3b;
      ppfStack_540 = (fdb_kvs_handle **)0x1186a6;
      fdb_doc_free((fdb_doc *)local_528._0_8_);
      local_528._0_8_ = (fdb_kvs_handle *)0x0;
      ppfStack_540 = (fdb_kvs_handle **)0x1186b9;
      fVar4 = fdb_iterator_next((fdb_iterator *)local_528._16_8_);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_540 = (fdb_kvs_handle **)0x1186cd;
    fdb_commit((fdb_file_handle *)local_528._32_8_,'\x01');
    ppfStack_540 = (fdb_kvs_handle **)0x1186d7;
    fVar4 = fdb_iterator_prev((fdb_iterator *)local_528._8_8_);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00118a70:
      ppfStack_540 = (fdb_kvs_handle **)0x118a75;
      reverse_sequence_iterator_kvs_test();
LAB_00118a75:
      ppfStack_540 = (fdb_kvs_handle **)0x118a7a;
      reverse_sequence_iterator_kvs_test();
      goto LAB_00118a7a;
    }
    unaff_RBP = (fdb_kvs_handle **)0x4;
    ppfVar14 = (fdb_kvs_handle **)((long)local_4f8 + 0x30);
    pfVar6 = (fdb_kvs_handle *)local_528;
    do {
      ppfStack_540 = (fdb_kvs_handle **)0x1186fc;
      fVar4 = fdb_iterator_get((fdb_iterator *)local_528._8_8_,(fdb_doc **)pfVar6);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a40;
      ppfStack_540 = (fdb_kvs_handle **)0x11871c;
      iVar5 = bcmp(*(kvs_ops_stat **)(local_528._0_8_ + 0x20),(*ppfVar14)->op_stats,
                   *(size_t *)(fdb_kvs_config *)local_528._0_8_);
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x118793;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x118739;
      iVar5 = bcmp(*(btree **)(local_528._0_8_ + 0x38),(*ppfVar14)->staletree,
                   (size_t)*(fdb_custom_cmp_variable *)(local_528._0_8_ + 8));
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x1187a0;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x118756;
      iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_528._0_8_ + 0x40))->
                   seqtree,((*ppfVar14)->field_6).seqtree,(size_t)*(void **)(local_528._0_8_ + 0x10)
                  );
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x1187ad;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x118764;
      fdb_doc_free((fdb_doc *)local_528._0_8_);
      local_528._0_8_ = (fdb_kvs_handle *)0x0;
      ppfStack_540 = (fdb_kvs_handle **)0x118777;
      fVar4 = fdb_iterator_prev((fdb_iterator *)local_528._8_8_);
      ppfVar14 = ppfVar14 + 0xfffffffffffffffe;
      uVar18 = (int)unaff_RBP - 1;
      unaff_RBP = (fdb_kvs_handle **)(ulong)uVar18;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar18 != 0) goto LAB_00118a70;
    ppfStack_540 = (fdb_kvs_handle **)0x1187c1;
    fdb_iterator_close((fdb_iterator *)local_528._8_8_);
    ppfStack_540 = (fdb_kvs_handle **)0x1187cb;
    fVar4 = fdb_iterator_prev((fdb_iterator *)local_528._16_8_);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00118a75;
    unaff_RBP = (fdb_kvs_handle **)0xa;
    ppfVar14 = &local_430;
    pfVar6 = (fdb_kvs_handle *)local_528;
    do {
      ppfStack_540 = (fdb_kvs_handle **)0x1187f3;
      fVar4 = fdb_iterator_get((fdb_iterator *)local_528._16_8_,(fdb_doc **)pfVar6);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a45;
      ppfStack_540 = (fdb_kvs_handle **)0x118813;
      iVar5 = bcmp(*(kvs_ops_stat **)(local_528._0_8_ + 0x20),(*ppfVar14)->op_stats,
                   *(size_t *)(fdb_kvs_config *)local_528._0_8_);
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x11888a;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x118830;
      iVar5 = bcmp(*(btree **)(local_528._0_8_ + 0x38),(*ppfVar14)->staletree,
                   (size_t)*(fdb_custom_cmp_variable *)(local_528._0_8_ + 8));
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x118897;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x11884d;
      iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_528._0_8_ + 0x40))->
                   seqtree,((*ppfVar14)->field_6).seqtree,(size_t)*(void **)(local_528._0_8_ + 0x10)
                  );
      if (iVar5 != 0) {
        ppfStack_540 = (fdb_kvs_handle **)0x1188a4;
        reverse_sequence_iterator_kvs_test();
      }
      ppfStack_540 = (fdb_kvs_handle **)0x11885b;
      fdb_doc_free((fdb_doc *)local_528._0_8_);
      local_528._0_8_ = (fdb_kvs_handle *)0x0;
      ppfStack_540 = (fdb_kvs_handle **)0x11886e;
      fVar4 = fdb_iterator_prev((fdb_iterator *)local_528._16_8_);
      ppfVar14 = ppfVar14 + 0xffffffffffffffff;
      uVar18 = (int)unaff_RBP - 1;
      unaff_RBP = (fdb_kvs_handle **)(ulong)uVar18;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar18 != 0) goto LAB_00118a75;
    ppfStack_540 = (fdb_kvs_handle **)0x1188b8;
    fdb_iterator_close((fdb_iterator *)local_528._16_8_);
    unaff_R13 = (fdb_kvs_handle **)0x0;
    ppfStack_540 = (fdb_kvs_handle **)0x1188d1;
    fVar4 = fdb_iterator_sequence_init
                      ((fdb_kvs_handle *)local_528._24_8_,(fdb_iterator **)(local_528 + 8),0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a93;
    unaff_RBP = (fdb_kvs_handle **)0xa;
    pfVar13 = pfVar6;
    do {
      ppfStack_540 = (fdb_kvs_handle **)0x1188ed;
      fVar4 = fdb_iterator_get((fdb_iterator *)local_528._8_8_,(fdb_doc **)local_528);
      pfVar6 = (fdb_kvs_handle *)local_528._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a55;
      pbVar12 = *(btree **)(local_528._0_8_ + 0x20);
      iVar20 = (int)unaff_R13;
      ppfVar14 = *(fdb_kvs_handle ***)((long)local_4f8 + (long)iVar20 * 8);
      unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ppfVar14[4];
      ppfStack_540 = (fdb_kvs_handle **)0x118918;
      iVar5 = bcmp(pbVar12,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)local_528._0_8_);
      if (iVar5 != 0) goto LAB_00118a4a;
      pbVar12 = *(btree **)((long)pfVar6 + 0x38);
      unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ppfVar14[7];
      ppfStack_540 = (fdb_kvs_handle **)0x118937;
      iVar5 = bcmp(pbVar12,(void *)unaff_R12,(size_t)*(fdb_custom_cmp_variable *)((long)pfVar6 + 8))
      ;
      if (iVar5 != 0) goto LAB_00118a65;
      pbVar12 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar6 + 0x40))->seqtree;
      unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ppfVar14[8];
      ppfStack_540 = (fdb_kvs_handle **)0x118956;
      iVar5 = bcmp(pbVar12,(void *)unaff_R12,(size_t)*(void **)((long)pfVar6 + 0x10));
      if (iVar5 != 0) goto LAB_00118a5a;
      ppfStack_540 = (fdb_kvs_handle **)0x118966;
      fdb_doc_free((fdb_doc *)pfVar6);
      local_528._0_8_ = (fdb_kvs_handle *)0x0;
      uVar18 = iVar20 + 2;
      if (iVar20 == 8) {
        uVar18 = 1;
      }
      ppfVar14 = (fdb_kvs_handle **)(ulong)uVar18;
      ppfStack_540 = (fdb_kvs_handle **)0x118989;
      fVar4 = fdb_iterator_next((fdb_iterator *)local_528._8_8_);
      uVar19 = (int)unaff_RBP - 1;
      unaff_RBP = (fdb_kvs_handle **)(ulong)uVar19;
      unaff_R13 = (fdb_kvs_handle **)(ulong)uVar18;
      pfVar13 = pfVar6;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar19 == 0) {
      ppfStack_540 = (fdb_kvs_handle **)0x1189a9;
      fdb_iterator_close((fdb_iterator *)local_528._8_8_);
      lVar22 = 0;
      do {
        ppfStack_540 = (fdb_kvs_handle **)0x1189b5;
        fdb_doc_free(*(fdb_doc **)((long)local_4f8 + lVar22 * 8));
        ppfStack_540 = (fdb_kvs_handle **)0x1189c2;
        fdb_doc_free(*(fdb_doc **)((long)&bStack_478 + lVar22 * 8));
        lVar22 = lVar22 + 1;
      } while (lVar22 != 10);
      ppfStack_540 = (fdb_kvs_handle **)0x1189d5;
      fdb_kvs_close((fdb_kvs_handle *)local_528._24_8_);
      ppfStack_540 = (fdb_kvs_handle **)0x1189df;
      fdb_kvs_close(local_500);
      ppfStack_540 = (fdb_kvs_handle **)0x1189e9;
      fdb_close((fdb_file_handle *)local_528._32_8_);
      ppfStack_540 = (fdb_kvs_handle **)0x1189ee;
      fdb_shutdown();
      ppfStack_540 = (fdb_kvs_handle **)0x1189f3;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (reverse_sequence_iterator_kvs_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      ppfStack_540 = (fdb_kvs_handle **)0x118a24;
      fprintf(_stderr,pcVar21,"reverse sequence iterator kvs test");
      return;
    }
  }
  else {
LAB_00118a7a:
    ppfStack_540 = (fdb_kvs_handle **)0x118a7f;
    reverse_sequence_iterator_kvs_test();
LAB_00118a7f:
    ppfStack_540 = (fdb_kvs_handle **)0x118a84;
    reverse_sequence_iterator_kvs_test();
LAB_00118a84:
    ppfStack_540 = (fdb_kvs_handle **)0x118a89;
    reverse_sequence_iterator_kvs_test();
LAB_00118a89:
    ppfStack_540 = (fdb_kvs_handle **)0x118a8e;
    reverse_sequence_iterator_kvs_test();
LAB_00118a8e:
    ppfStack_540 = (fdb_kvs_handle **)0x118a93;
    reverse_sequence_iterator_kvs_test();
LAB_00118a93:
    ppfStack_540 = (fdb_kvs_handle **)0x118a98;
    reverse_sequence_iterator_kvs_test();
  }
  ppfStack_540 = (fdb_kvs_handle **)reverse_iterator_test;
  reverse_sequence_iterator_kvs_test();
  ppfStack_a18 = (fdb_file_handle **)0x118ac0;
  ppfStack_568 = ppfVar14;
  aStack_560 = unaff_R12;
  ppfStack_558 = unaff_R13;
  pfStack_550 = pfVar6;
  pbStack_548 = pbVar12;
  ppfStack_540 = unaff_RBP;
  gettimeofday(&tStack_988,(__timezone_ptr_t)0x0);
  ppfStack_a18 = (fdb_file_handle **)0x118ac5;
  memleak_start();
  auStack_a00._0_8_ = (fdb_doc *)0x0;
  ppfStack_a18 = (fdb_file_handle **)0x118ad6;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_a18 = (fdb_file_handle **)0x118ae6;
  fdb_get_default_config();
  doc_01 = afStack_978;
  ppfStack_a18 = (fdb_file_handle **)0x118af6;
  fdb_get_default_kvs_config();
  fStack_660.buffercache_size = 0;
  fStack_660.wal_threshold = 0x400;
  fStack_660.flags = 1;
  fStack_660.compaction_threshold = '\0';
  _Var10._M_i = (__int_type)&pfStack_9e8;
  ppfStack_a18 = (fdb_file_handle **)0x118b24;
  fdb_open((fdb_file_handle **)_Var10._M_i,"./iterator_test1",&fStack_660);
  pfVar16 = (fdb_doc *)(auStack_a00 + 0x10);
  ppfStack_a18 = (fdb_file_handle **)0x118b37;
  fdb_kvs_open_default(pfStack_9e8,(fdb_kvs_handle **)pfVar16,(fdb_kvs_config *)doc_01);
  ppfStack_a18 = (fdb_file_handle **)0x118b4d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_a00._16_8_,logCallbackFunc,"reverse_iterator_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001192b5;
  lVar22 = 0;
  uVar27 = 0;
  do {
    ppfStack_a18 = (fdb_file_handle **)0x118b75;
    sprintf(acStack_760,"key%d",uVar27 & 0xffffffff);
    ppfStack_a18 = (fdb_file_handle **)0x118b8d;
    sprintf(acStack_860,"meta%d",uVar27 & 0xffffffff);
    ppfStack_a18 = (fdb_file_handle **)0x118ba5;
    sprintf((char *)&afStack_978[0].size_ondisk,"body%d",uVar27 & 0xffffffff);
    ppfStack_a18 = (fdb_file_handle **)0x118bb5;
    sVar7 = strlen(acStack_760);
    ppfStack_a18 = (fdb_file_handle **)0x118bc8;
    sVar8 = strlen(acStack_860);
    ppfStack_a18 = (fdb_file_handle **)0x118bd8;
    sVar9 = strlen((char *)&afStack_978[0].size_ondisk);
    ppfStack_a18 = (fdb_file_handle **)0x118bfd;
    fdb_doc_create((fdb_doc **)((long)aaStack_9e0 + lVar22),acStack_760,sVar7,acStack_860,sVar8,
                   &afStack_978[0].size_ondisk,sVar9);
    ppfStack_a18 = (fdb_file_handle **)0x118c0c;
    fdb_set((fdb_kvs_handle *)auStack_a00._16_8_,(fdb_doc *)aaStack_9e0[uVar27]);
    lVar22 = lVar22 + 0x10;
    bVar28 = uVar27 < 8;
    uVar27 = uVar27 + 2;
  } while (bVar28);
  ppfStack_a18 = (fdb_file_handle **)0x118c30;
  fdb_commit(pfStack_9e8,'\x01');
  lVar22 = 8;
  pfVar16 = (fdb_doc *)0x1;
  do {
    ppfStack_a18 = (fdb_file_handle **)0x118c58;
    sprintf(acStack_760,"key%d",(ulong)pfVar16 & 0xffffffff);
    ppfStack_a18 = (fdb_file_handle **)0x118c71;
    sprintf(acStack_860,"meta%d",(ulong)pfVar16 & 0xffffffff);
    ppfStack_a18 = (fdb_file_handle **)0x118c8a;
    sprintf((char *)&afStack_978[0].size_ondisk,"body%d",(ulong)pfVar16 & 0xffffffff);
    unaff_R12.end_seqnum = (long)aaStack_9e0 + lVar22;
    ppfStack_a18 = (fdb_file_handle **)0x118c9a;
    unaff_RBP = (fdb_kvs_handle **)strlen(acStack_760);
    ppfStack_a18 = (fdb_file_handle **)0x118cad;
    _Var10._M_i = strlen(acStack_860);
    ppfStack_a18 = (fdb_file_handle **)0x118cbd;
    sVar7 = strlen((char *)&afStack_978[0].size_ondisk);
    ppfStack_a18 = (fdb_file_handle **)0x118ce2;
    fdb_doc_create((fdb_doc **)unaff_R12,acStack_760,(size_t)unaff_RBP,acStack_860,_Var10._M_i,
                   &afStack_978[0].size_ondisk,sVar7);
    ppfStack_a18 = (fdb_file_handle **)0x118cf1;
    fdb_set((fdb_kvs_handle *)auStack_a00._16_8_,(fdb_doc *)aaStack_9e0[(long)pfVar16]);
    pbVar2 = (bool *)&pfVar16->keylen;
    lVar22 = lVar22 + 0x10;
    bVar28 = pfVar16 < (fdb_doc *)0x8;
    pfVar16 = (fdb_doc *)(pbVar2 + 2);
  } while (bVar28);
  ppfStack_a18 = (fdb_file_handle **)0x118d12;
  fdb_commit(pfStack_9e8,'\0');
  ppfStack_a18 = (fdb_file_handle **)0x118d32;
  fdb_iterator_init((fdb_kvs_handle *)auStack_a00._16_8_,(fdb_iterator **)(auStack_a00 + 8),
                    (void *)0x0,0,(void *)0x0,0,0);
  unaff_R13 = (fdb_kvs_handle **)0xffffffffffffffff;
  pfVar16 = (fdb_doc *)auStack_a00;
  pfVar15 = (fdb_doc *)(pbVar2 + 2);
  do {
    ppfStack_a18 = (fdb_file_handle **)0x118d4b;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_a00._8_8_,(fdb_doc **)pfVar16);
    doc_01 = (fdb_doc *)auStack_a00._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00119228:
      ppfStack_a18 = (fdb_file_handle **)0x11922d;
      reverse_iterator_test();
      doc_01 = pfVar15;
LAB_0011922d:
      ppfStack_a18 = (fdb_file_handle **)0x119238;
      reverse_iterator_test();
LAB_00119238:
      ppfStack_a18 = (fdb_file_handle **)0x119243;
      reverse_iterator_test();
      goto LAB_00119243;
    }
    _Var10._M_i = *(__int_type *)(auStack_a00._0_8_ + 0x20);
    unaff_RBP = (fdb_kvs_handle **)aaStack_9e0[(long)((long)unaff_R13 + 1)].end_seqnum;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
    ppfStack_a18 = (fdb_file_handle **)0x118d73;
    iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)auStack_a00._0_8_);
    pfVar15 = doc_01;
    if (iVar5 != 0) {
      ppfStack_a18 = (fdb_file_handle **)0x119228;
      reverse_iterator_test();
      goto LAB_00119228;
    }
    _Var10._M_i = *(__int_type *)((long)doc_01 + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
    ppfStack_a18 = (fdb_file_handle **)0x118d92;
    iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)((long)doc_01 + 8));
    if (iVar5 != 0) goto LAB_00119238;
    _Var10._M_i = *(__int_type *)((long)doc_01 + 0x40);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
    ppfStack_a18 = (fdb_file_handle **)0x118db1;
    iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)((long)doc_01 + 0x10));
    if (iVar5 != 0) goto LAB_0011922d;
    ppfStack_a18 = (fdb_file_handle **)0x118dc1;
    fdb_doc_free(doc_01);
    auStack_a00._0_8_ = (fdb_doc *)0x0;
    ppfStack_a18 = (fdb_file_handle **)0x118dd4;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_a00._8_8_);
    unaff_R13 = (fdb_kvs_handle **)((long)unaff_R13 + 1);
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (unaff_R13 != (fdb_kvs_handle **)0x9) goto LAB_001192ba;
  ppfStack_a18 = (fdb_file_handle **)0x118df4;
  fVar4 = fdb_iterator_prev((fdb_iterator *)auStack_a00._8_8_);
  if (fVar4 != FDB_RESULT_ITERATOR_FAIL) {
    pfVar16 = doc_01;
    do {
      ppfStack_a18 = (fdb_file_handle **)0x118e0f;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_a00._8_8_,(fdb_doc **)auStack_a00);
      doc_01 = (fdb_doc *)auStack_a00._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011928f;
      _Var10._M_i = *(__int_type *)(auStack_a00._0_8_ + 0x20);
      unaff_RBP = (fdb_kvs_handle **)aaStack_9e0[(long)unaff_R13].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
      ppfStack_a18 = (fdb_file_handle **)0x118e37;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)auStack_a00._0_8_);
      if (iVar5 != 0) goto LAB_0011929f;
      _Var10._M_i = *(__int_type *)((long)doc_01 + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
      ppfStack_a18 = (fdb_file_handle **)0x118e56;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)((long)doc_01 + 8));
      if (iVar5 != 0) goto LAB_00119294;
      _Var10._M_i = *(__int_type *)((long)doc_01 + 0x40);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
      ppfStack_a18 = (fdb_file_handle **)0x118e75;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)((long)doc_01 + 0x10));
      if (iVar5 != 0) goto LAB_001192aa;
      ppfStack_a18 = (fdb_file_handle **)0x118e85;
      fdb_doc_free(doc_01);
      auStack_a00._0_8_ = (fdb_doc *)0x0;
      if (unaff_R13 == (fdb_kvs_handle **)0x5) goto LAB_00118eb5;
      unaff_R13 = (fdb_kvs_handle **)((long)unaff_R13 + -1);
      ppfStack_a18 = (fdb_file_handle **)0x118ea1;
      fVar4 = fdb_iterator_prev((fdb_iterator *)auStack_a00._8_8_);
      pfVar16 = doc_01;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  }
  if ((int)unaff_R13 != 5) {
    ppfStack_a18 = (fdb_file_handle **)0x118eb5;
    reverse_iterator_test();
LAB_00118eb5:
    unaff_R13 = (fdb_kvs_handle **)0x5;
  }
  pfVar16 = (fdb_doc *)auStack_a00;
  ppfStack_a18 = (fdb_file_handle **)0x118ec5;
  fVar4 = fdb_iterator_next((fdb_iterator *)auStack_a00._8_8_);
  if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001192bf;
  ppfStack_a18 = (fdb_file_handle **)0x118edd;
  fVar4 = fdb_iterator_get((fdb_iterator *)auStack_a00._8_8_,(fdb_doc **)auStack_a00);
  pfVar15 = (fdb_doc *)auStack_a00._0_8_;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001192c4;
  unaff_RBP = (fdb_kvs_handle **)(ulong)((int)unaff_R13 + 1);
  doc_01 = *(fdb_doc **)(auStack_a00._0_8_ + 0x20);
  unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)aaStack_9e0[(long)unaff_RBP].end_seqnum;
  _Var10._M_i = (((atomic<unsigned_long> *)(unaff_R12.end_seqnum + 0x20))->
                super___atomic_base<unsigned_long>)._M_i;
  ppfStack_a18 = (fdb_file_handle **)0x118f0c;
  iVar5 = bcmp(doc_01,(void *)_Var10._M_i,*(size_t *)auStack_a00._0_8_);
  unaff_R13 = unaff_RBP;
  if (iVar5 != 0) goto LAB_001192c9;
  doc_01 = *(fdb_doc **)((long)pfVar15 + 0x38);
  _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(unaff_R12.end_seqnum + 0x38))->num_sets;
  ppfStack_a18 = (fdb_file_handle **)0x118f2c;
  iVar5 = bcmp(doc_01,(void *)_Var10._M_i,*(size_t *)((long)pfVar15 + 8));
  if (iVar5 != 0) goto LAB_001192d4;
  doc_01 = *(fdb_doc **)((long)pfVar15 + 0x40);
  _Var10._M_i = (((atomic<unsigned_long> *)(unaff_R12.end_seqnum + 0x40))->
                super___atomic_base<unsigned_long>)._M_i;
  ppfStack_a18 = (fdb_file_handle **)0x118f4c;
  iVar5 = bcmp(doc_01,(void *)_Var10._M_i,*(size_t *)((long)pfVar15 + 0x10));
  if (iVar5 != 0) goto LAB_001192df;
  ppfStack_a18 = (fdb_file_handle **)0x118f5c;
  fdb_doc_free(pfVar15);
  auStack_a00._0_8_ = (fdb_doc *)0x0;
  ppfStack_a18 = (fdb_file_handle **)0x118f6f;
  fVar4 = fdb_iterator_next((fdb_iterator *)auStack_a00._8_8_);
  if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001192ea;
  ppfStack_a18 = (fdb_file_handle **)0x118f87;
  fVar4 = fdb_iterator_get((fdb_iterator *)auStack_a00._8_8_,(fdb_doc **)auStack_a00);
  pfVar16 = (fdb_doc *)auStack_a00._0_8_;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001192ef;
  doc_01 = *(fdb_doc **)(auStack_a00._0_8_ + 0x20);
  _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_9e0[7].end_seqnum + 0x20))->
                super___atomic_base<unsigned_long>)._M_i;
  ppfStack_a18 = (fdb_file_handle **)0x118fb0;
  iVar5 = bcmp(doc_01,(void *)_Var10._M_i,*(size_t *)auStack_a00._0_8_);
  unaff_R12 = aaStack_9e0[7];
  if (iVar5 != 0) goto LAB_001192f4;
  doc_01 = *(fdb_doc **)((long)pfVar16 + 0x38);
  _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aaStack_9e0[7].end_seqnum + 0x38))->num_sets;
  ppfStack_a18 = (fdb_file_handle **)0x118fd0;
  iVar5 = bcmp(doc_01,(void *)_Var10._M_i,*(size_t *)((long)pfVar16 + 8));
  if (iVar5 != 0) goto LAB_001192ff;
  doc_01 = *(fdb_doc **)((long)pfVar16 + 0x40);
  _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_9e0[7].end_seqnum + 0x40))->
                super___atomic_base<unsigned_long>)._M_i;
  ppfStack_a18 = (fdb_file_handle **)0x118ff0;
  iVar5 = bcmp(doc_01,(void *)_Var10._M_i,*(size_t *)((long)pfVar16 + 0x10));
  if (iVar5 != 0) goto LAB_0011930a;
  ppfStack_a18 = (fdb_file_handle **)0x119000;
  fdb_doc_free(pfVar16);
  auStack_a00._0_8_ = (fdb_doc *)0x0;
  ppfStack_a18 = (fdb_file_handle **)0x119013;
  fVar4 = fdb_iterator_prev((fdb_iterator *)auStack_a00._8_8_);
  if (fVar4 != FDB_RESULT_ITERATOR_FAIL) {
    pfVar16 = (fdb_doc *)auStack_a00;
    pfVar15 = doc_01;
    do {
      ppfStack_a18 = (fdb_file_handle **)0x11902e;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_a00._8_8_,(fdb_doc **)pfVar16);
      doc_01 = (fdb_doc *)auStack_a00._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119274;
      _Var10._M_i = *(__int_type *)(auStack_a00._0_8_ + 0x20);
      unaff_R13 = (fdb_kvs_handle **)aaStack_9e0[(long)unaff_RBP].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13 + 4);
      ppfStack_a18 = (fdb_file_handle **)0x119056;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)auStack_a00._0_8_);
      if (iVar5 != 0) goto LAB_00119269;
      _Var10._M_i = *(__int_type *)((long)doc_01 + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13 + 7);
      ppfStack_a18 = (fdb_file_handle **)0x119075;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)((long)doc_01 + 8));
      if (iVar5 != 0) goto LAB_00119284;
      _Var10._M_i = *(__int_type *)((long)doc_01 + 0x40);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13 + 8);
      ppfStack_a18 = (fdb_file_handle **)0x119094;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)((long)doc_01 + 0x10));
      if (iVar5 != 0) goto LAB_00119279;
      ppfStack_a18 = (fdb_file_handle **)0x1190a4;
      fdb_doc_free(doc_01);
      auStack_a00._0_8_ = (fdb_doc *)0x0;
      unaff_RBP = (fdb_kvs_handle **)((long)unaff_RBP + -1);
      ppfStack_a18 = (fdb_file_handle **)0x1190ba;
      fVar4 = fdb_iterator_prev((fdb_iterator *)auStack_a00._8_8_);
      pfVar15 = doc_01;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    unaff_R13 = (fdb_kvs_handle **)((ulong)unaff_RBP & 0xffffffff);
  }
  if ((int)unaff_R13 != -1) goto LAB_00119315;
  ppfStack_a18 = (fdb_file_handle **)0x1190da;
  fVar4 = fdb_iterator_next((fdb_iterator *)auStack_a00._8_8_);
  if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
    ppfStack_a18 = (fdb_file_handle **)0x1190e9;
    reverse_iterator_test();
  }
  unaff_R13 = (fdb_kvs_handle **)0x0;
  pfVar16 = (fdb_doc *)auStack_a00;
  pfVar15 = doc_01;
  do {
    ppfStack_a18 = (fdb_file_handle **)0x1190fe;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_a00._8_8_,(fdb_doc **)pfVar16);
    doc_01 = (fdb_doc *)auStack_a00._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011924e;
    _Var10._M_i = *(__int_type *)(auStack_a00._0_8_ + 0x20);
    unaff_RBP = (fdb_kvs_handle **)aaStack_9e0[(long)unaff_R13].end_seqnum;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
    ppfStack_a18 = (fdb_file_handle **)0x119126;
    iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)auStack_a00._0_8_);
    if (iVar5 != 0) goto LAB_00119243;
    _Var10._M_i = *(__int_type *)((long)doc_01 + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
    ppfStack_a18 = (fdb_file_handle **)0x119145;
    iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)((long)doc_01 + 8));
    if (iVar5 != 0) goto LAB_0011925e;
    _Var10._M_i = *(__int_type *)((long)doc_01 + 0x40);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
    ppfStack_a18 = (fdb_file_handle **)0x119164;
    iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,*(size_t *)((long)doc_01 + 0x10));
    if (iVar5 != 0) goto LAB_00119253;
    ppfStack_a18 = (fdb_file_handle **)0x119174;
    fdb_doc_free(doc_01);
    auStack_a00._0_8_ = (fdb_doc *)0x0;
    unaff_R13 = (fdb_kvs_handle **)((long)unaff_R13 + 1);
    ppfStack_a18 = (fdb_file_handle **)0x11918a;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_a00._8_8_);
    pfVar15 = doc_01;
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (unaff_R13 == (fdb_kvs_handle **)0xa) {
    ppfStack_a18 = (fdb_file_handle **)0x1191a7;
    fdb_iterator_close((fdb_iterator *)auStack_a00._8_8_);
    ppfStack_a18 = (fdb_file_handle **)0x1191b1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_a00._16_8_);
    ppfStack_a18 = (fdb_file_handle **)0x1191bb;
    fdb_close(pfStack_9e8);
    lVar22 = 0;
    do {
      ppfStack_a18 = (fdb_file_handle **)0x1191c7;
      fdb_doc_free((fdb_doc *)aaStack_9e0[lVar22]);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 10);
    ppfStack_a18 = (fdb_file_handle **)0x1191d5;
    fdb_shutdown();
    ppfStack_a18 = (fdb_file_handle **)0x1191da;
    memleak_end();
    pcVar21 = "%s PASSED\n";
    if (reverse_iterator_test()::__test_pass != '\0') {
      pcVar21 = "%s FAILED\n";
    }
    ppfStack_a18 = (fdb_file_handle **)0x11920b;
    fprintf(_stderr,pcVar21,"reverse iterator test");
    return;
  }
  goto LAB_0011931a;
LAB_00118a3b:
  ppfStack_540 = (fdb_kvs_handle **)0x118a40;
  reverse_sequence_iterator_kvs_test();
LAB_00118a40:
  ppfStack_540 = (fdb_kvs_handle **)0x118a45;
  reverse_sequence_iterator_kvs_test();
LAB_00118a45:
  ppfStack_540 = (fdb_kvs_handle **)0x118a4a;
  reverse_sequence_iterator_kvs_test();
LAB_00118a4a:
  ppfStack_540 = (fdb_kvs_handle **)0x118a55;
  reverse_sequence_iterator_kvs_test();
  pfVar13 = pfVar6;
LAB_00118a55:
  pfVar6 = pfVar13;
  ppfStack_540 = (fdb_kvs_handle **)0x118a5a;
  reverse_sequence_iterator_kvs_test();
LAB_00118a5a:
  ppfStack_540 = (fdb_kvs_handle **)0x118a65;
  reverse_sequence_iterator_kvs_test();
LAB_00118a65:
  ppfStack_540 = (fdb_kvs_handle **)0x118a70;
  reverse_sequence_iterator_kvs_test();
  goto LAB_00118a70;
LAB_0011a231:
  ppfStack_1398 = (fdb_kvs_handle **)0x11a23c;
  iterator_seek_wal_only_test();
  _Var25._M_i = doc._M_i;
LAB_0011a23c:
  doc._M_i = _Var25._M_i;
  ppfStack_1398 = (fdb_kvs_handle **)0x11a241;
  iterator_seek_wal_only_test();
  pfVar6 = pfVar13;
LAB_0011a241:
  ppfStack_1398 = (fdb_kvs_handle **)0x11a24c;
  iterator_seek_wal_only_test();
LAB_0011a24c:
  ppfStack_1398 = (fdb_kvs_handle **)0x11a257;
  iterator_seek_wal_only_test();
LAB_0011a257:
  ppfStack_1398 = (fdb_kvs_handle **)0x11a262;
  iterator_seek_wal_only_test();
  _Var25._M_i = doc._M_i;
LAB_0011a262:
  doc._M_i = _Var25._M_i;
  ppfStack_1398 = (fdb_kvs_handle **)0x11a267;
  iterator_seek_wal_only_test();
LAB_0011a267:
  ppfStack_1398 = (fdb_kvs_handle **)0x11a272;
  iterator_seek_wal_only_test();
LAB_0011a272:
  ppfStack_1398 = (fdb_kvs_handle **)0x11a27d;
  iterator_seek_wal_only_test();
  goto LAB_0011a27d;
LAB_0011a6be:
  pcStack_1720 = (code *)0x11a6c3;
  iterator_after_wal_threshold();
  goto LAB_0011a6c3;
LAB_0011ab69:
  pfStack_18e8 = (fdb_kvs_handle *)0x11ab6e;
  iterator_manual_wal_flush();
LAB_0011ab6e:
  ptr_iterator = &pfStack_18d0;
  pfStack_18e8 = (fdb_kvs_handle *)0x11ab73;
  iterator_manual_wal_flush();
  goto LAB_0011ab73;
LAB_0011b161:
  pfStack_1db0 = (fdb_kvs_handle *)0x11b16c;
  sequence_iterator_seek_test();
  pfVar26 = pfVar17;
LAB_0011b16c:
  pfVar17 = pfVar26;
  pfStack_1db0 = (fdb_kvs_handle *)0x11b171;
  sequence_iterator_seek_test();
LAB_0011b171:
  pfStack_1db0 = (fdb_kvs_handle *)0x11b17c;
  sequence_iterator_seek_test();
LAB_0011b17c:
  pfStack_1db0 = (fdb_kvs_handle *)0x11b187;
  sequence_iterator_seek_test();
LAB_0011b187:
  pfStack_1db0 = (fdb_kvs_handle *)0x11b192;
  sequence_iterator_seek_test();
  pfVar26 = pfVar17;
  goto LAB_0011b192;
LAB_0011b4b1:
  ppfVar14 = &pfStack_2148;
  ppfStack_2158 = (fdb_doc **)0x11b4b6;
  iterator_concurrent_compaction();
  goto LAB_0011b4b6;
LAB_0011b9d5:
  ppfStack_4430 = (fdb_doc **)0x11b9da;
  iterator_offset_access_test();
LAB_0011b9da:
  ppfStack_4430 = (fdb_doc **)0x11b9df;
  iterator_offset_access_test();
LAB_0011b9df:
  ppfStack_4430 = (fdb_doc **)0x11b9e4;
  iterator_offset_access_test();
LAB_0011b9e4:
  ppfStack_4430 = (fdb_doc **)0x11b9e9;
  iterator_offset_access_test();
LAB_0011b9e9:
  ppfStack_4430 = (fdb_doc **)0x11b9ee;
  iterator_offset_access_test();
LAB_0011b9ee:
  ppfStack_4430 = (fdb_doc **)0x11b9f3;
  iterator_offset_access_test();
LAB_0011b9f3:
  ppfStack_4430 = (fdb_doc **)0x11b9f8;
  iterator_offset_access_test();
  goto LAB_0011b9f8;
LAB_00119243:
  ppfStack_a18 = (fdb_file_handle **)0x11924e;
  reverse_iterator_test();
  pfVar15 = doc_01;
LAB_0011924e:
  doc_01 = pfVar15;
  ppfStack_a18 = (fdb_file_handle **)0x119253;
  reverse_iterator_test();
LAB_00119253:
  ppfStack_a18 = (fdb_file_handle **)0x11925e;
  reverse_iterator_test();
LAB_0011925e:
  ppfStack_a18 = (fdb_file_handle **)0x119269;
  reverse_iterator_test();
LAB_00119269:
  ppfStack_a18 = (fdb_file_handle **)0x119274;
  reverse_iterator_test();
  pfVar15 = doc_01;
LAB_00119274:
  doc_01 = pfVar15;
  ppfStack_a18 = (fdb_file_handle **)0x119279;
  reverse_iterator_test();
LAB_00119279:
  ppfStack_a18 = (fdb_file_handle **)0x119284;
  reverse_iterator_test();
LAB_00119284:
  ppfStack_a18 = (fdb_file_handle **)0x11928f;
  reverse_iterator_test();
  pfVar16 = doc_01;
LAB_0011928f:
  doc_01 = pfVar16;
  ppfStack_a18 = (fdb_file_handle **)0x119294;
  reverse_iterator_test();
LAB_00119294:
  ppfStack_a18 = (fdb_file_handle **)0x11929f;
  reverse_iterator_test();
LAB_0011929f:
  ppfStack_a18 = (fdb_file_handle **)0x1192aa;
  reverse_iterator_test();
LAB_001192aa:
  pfVar16 = (fdb_doc *)auStack_a00;
  ppfStack_a18 = (fdb_file_handle **)0x1192b5;
  reverse_iterator_test();
LAB_001192b5:
  ppfStack_a18 = (fdb_file_handle **)0x1192ba;
  reverse_iterator_test();
LAB_001192ba:
  ppfStack_a18 = (fdb_file_handle **)0x1192bf;
  reverse_iterator_test();
LAB_001192bf:
  ppfStack_a18 = (fdb_file_handle **)0x1192c4;
  reverse_iterator_test();
LAB_001192c4:
  pfVar15 = pfVar16;
  ppfStack_a18 = (fdb_file_handle **)0x1192c9;
  reverse_iterator_test();
LAB_001192c9:
  ppfStack_a18 = (fdb_file_handle **)0x1192d4;
  reverse_iterator_test();
LAB_001192d4:
  ppfStack_a18 = (fdb_file_handle **)0x1192df;
  reverse_iterator_test();
LAB_001192df:
  ppfStack_a18 = (fdb_file_handle **)0x1192ea;
  reverse_iterator_test();
LAB_001192ea:
  ppfStack_a18 = (fdb_file_handle **)0x1192ef;
  reverse_iterator_test();
LAB_001192ef:
  pfVar16 = pfVar15;
  ppfStack_a18 = (fdb_file_handle **)0x1192f4;
  reverse_iterator_test();
LAB_001192f4:
  ppfStack_a18 = (fdb_file_handle **)0x1192ff;
  reverse_iterator_test();
LAB_001192ff:
  ppfStack_a18 = (fdb_file_handle **)0x11930a;
  reverse_iterator_test();
LAB_0011930a:
  ppfStack_a18 = (fdb_file_handle **)0x119315;
  reverse_iterator_test();
LAB_00119315:
  ppfStack_a18 = (fdb_file_handle **)0x11931a;
  reverse_iterator_test();
LAB_0011931a:
  ppfStack_a18 = (fdb_file_handle **)reverse_seek_to_max_nokey;
  reverse_iterator_test();
  ppfStack_ec0 = (fdb_kvs_handle **)0x119339;
  pfStack_a30 = pfVar16;
  aStack_a28 = unaff_R12;
  pfStack_a20 = doc_01;
  ppfStack_a18 = (fdb_file_handle **)_Var10._M_i;
  gettimeofday(&tStack_e58,(__timezone_ptr_t)0x0);
  ppfStack_ec0 = (fdb_kvs_handle **)0x11933e;
  memleak_start();
  ppfStack_ec0 = (fdb_kvs_handle **)0x11934a;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcVar21 = (char *)&fStack_b28;
  ppfStack_ec0 = (fdb_kvs_handle **)0x11935a;
  fdb_get_default_config();
  ppfStack_ec0 = (fdb_kvs_handle **)0x119364;
  fdb_get_default_kvs_config();
  fStack_b28.buffercache_size = 0;
  ppfStack_ec0 = (fdb_kvs_handle **)0x119380;
  fVar4 = fdb_open(&pfStack_e90,"./iterator_test1",(fdb_config *)pcVar21);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_ec0 = (fdb_kvs_handle **)0x11939c;
    fVar4 = fdb_kvs_open_default
                      (pfStack_e90,(fdb_kvs_handle **)(auStack_ea8 + 8),
                       (fdb_kvs_config *)(auStack_e88 + 0x18));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119611;
    pcVar21 = "doc-%03d";
    doc_01 = (fdb_doc *)auStack_e88;
    unaff_R12.end_seqnum = 0;
    uVar27 = 0;
    do {
      ppfStack_ec0 = (fdb_kvs_handle **)0x1193c6;
      sprintf((char *)doc_01,"doc-%03d",uVar27 & 0xffffffff);
      auStack_e88._7_2_ = 0;
      ppfStack_ec0 = (fdb_kvs_handle **)0x1193f2;
      fdb_doc_create((fdb_doc **)((long)apfStack_e48 + unaff_R12.end_seqnum),doc_01,10,(void *)0x0,0
                     ,doc_01,10);
      ppfStack_ec0 = (fdb_kvs_handle **)0x119401;
      fdb_set((fdb_kvs_handle *)auStack_ea8._8_8_,apfStack_e48[uVar27]);
      uVar27 = uVar27 + 1;
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (uVar27 != 100);
    ppfStack_ec0 = (fdb_kvs_handle **)0x11941a;
    fdb_commit(pfStack_e90,'\0');
    ppfStack_ec0 = (fdb_kvs_handle **)0x119432;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_ea8._8_8_,logCallbackFunc,
                       "reverse_seek_to_max_nokey");
    _Var10._M_i = 100;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119616;
    ppfStack_ec0 = (fdb_kvs_handle **)0x11946e;
    fVar4 = fdb_iterator_init((fdb_kvs_handle *)auStack_ea8._8_8_,(fdb_iterator **)auStack_ea8,
                              *(void **)(lStack_d88 + 0x20),10,"doc-029b",10,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011961b;
    ppfStack_ec0 = (fdb_kvs_handle **)0x119480;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_ea8._0_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119620;
    pcVar21 = auStack_ea8 + 0x10;
    ppfStack_ec0 = (fdb_kvs_handle **)0x1194a9;
    fdb_doc_create((fdb_doc **)pcVar21,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    ppfStack_ec0 = (fdb_kvs_handle **)0x1194b6;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_ea8._0_8_,(fdb_doc **)pcVar21);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119625;
    if (**(long **)(auStack_ea8._16_8_ + 0x20) != 0x3932302d636f64) goto LAB_0011962a;
    ppfStack_ec0 = (fdb_kvs_handle **)0x1194df;
    fdb_doc_free((fdb_doc *)auStack_ea8._16_8_);
    pcVar21 = auStack_ea8;
    ppfStack_ec0 = (fdb_kvs_handle **)0x1194ec;
    fdb_iterator_close((fdb_iterator *)auStack_ea8._0_8_);
    ppfStack_ec0 = (fdb_kvs_handle **)0x11951e;
    fVar4 = fdb_iterator_init((fdb_kvs_handle *)auStack_ea8._8_8_,(fdb_iterator **)pcVar21,
                              "doc-024b",10,*(void **)(lStack_d58 + 0x20),10,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119632;
    ppfStack_ec0 = (fdb_kvs_handle **)0x119530;
    fVar4 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_ea8._0_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119637;
    pcVar21 = auStack_ea8 + 0x10;
    ppfStack_ec0 = (fdb_kvs_handle **)0x119559;
    fdb_doc_create((fdb_doc **)pcVar21,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    ppfStack_ec0 = (fdb_kvs_handle **)0x119566;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_ea8._0_8_,(fdb_doc **)pcVar21);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011963c;
    if (**(long **)(auStack_ea8._16_8_ + 0x20) == 0x3532302d636f64) {
      ppfStack_ec0 = (fdb_kvs_handle **)0x11958f;
      fdb_doc_free((fdb_doc *)auStack_ea8._16_8_);
      ppfStack_ec0 = (fdb_kvs_handle **)0x119599;
      fdb_iterator_close((fdb_iterator *)auStack_ea8._0_8_);
      ppfStack_ec0 = (fdb_kvs_handle **)0x1195a3;
      fdb_kvs_close((fdb_kvs_handle *)auStack_ea8._8_8_);
      ppfStack_ec0 = (fdb_kvs_handle **)0x1195ad;
      fdb_close(pfStack_e90);
      lVar22 = 0;
      do {
        ppfStack_ec0 = (fdb_kvs_handle **)0x1195b9;
        fdb_doc_free(apfStack_e48[lVar22]);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 100);
      ppfStack_ec0 = (fdb_kvs_handle **)0x1195c7;
      fdb_shutdown();
      ppfStack_ec0 = (fdb_kvs_handle **)0x1195cc;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (reverse_seek_to_max_nokey()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      ppfStack_ec0 = (fdb_kvs_handle **)0x1195fd;
      fprintf(_stderr,pcVar21,"reverse seek to max non-existent key test");
      return;
    }
  }
  else {
    ppfStack_ec0 = (fdb_kvs_handle **)0x119611;
    reverse_seek_to_max_nokey();
LAB_00119611:
    ppfStack_ec0 = (fdb_kvs_handle **)0x119616;
    reverse_seek_to_max_nokey();
LAB_00119616:
    ppfStack_ec0 = (fdb_kvs_handle **)0x11961b;
    reverse_seek_to_max_nokey();
LAB_0011961b:
    ppfStack_ec0 = (fdb_kvs_handle **)0x119620;
    reverse_seek_to_max_nokey();
LAB_00119620:
    ppfStack_ec0 = (fdb_kvs_handle **)0x119625;
    reverse_seek_to_max_nokey();
LAB_00119625:
    ppfStack_ec0 = (fdb_kvs_handle **)0x11962a;
    reverse_seek_to_max_nokey();
LAB_0011962a:
    ppfStack_ec0 = (fdb_kvs_handle **)0x119632;
    reverse_seek_to_max_nokey();
LAB_00119632:
    ppfStack_ec0 = (fdb_kvs_handle **)0x119637;
    reverse_seek_to_max_nokey();
LAB_00119637:
    ppfStack_ec0 = (fdb_kvs_handle **)0x11963c;
    reverse_seek_to_max_nokey();
LAB_0011963c:
    ppfStack_ec0 = (fdb_kvs_handle **)0x119641;
    reverse_seek_to_max_nokey();
  }
  ppfStack_ec0 = (fdb_kvs_handle **)iterator_seek_wal_only_test;
  reverse_seek_to_max_nokey();
  ppfStack_1398 = (fdb_kvs_handle **)0x11966c;
  pfStack_ee8 = (fdb_config *)pcVar21;
  aStack_ee0 = unaff_R12;
  ppfStack_ed8 = unaff_R13;
  pfStack_ed0 = doc_01;
  ppfStack_ec8 = (fdb_file_handle **)_Var10._M_i;
  ppfStack_ec0 = unaff_RBP;
  gettimeofday((timeval *)(auStack_1308 + 0x18),(__timezone_ptr_t)0x0);
  ppfStack_1398 = (fdb_kvs_handle **)0x119671;
  memleak_start();
  auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_1398 = (fdb_kvs_handle **)0x119682;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_1398 = (fdb_kvs_handle **)0x119692;
  fdb_get_default_config();
  doc._M_i = (__int_type)auStack_1308;
  ppfStack_1398 = (fdb_kvs_handle **)0x1196a2;
  fdb_get_default_kvs_config();
  fStack_fe0.buffercache_size = 0;
  fStack_fe0.wal_threshold = 0x400;
  fStack_fe0.flags = 1;
  fStack_fe0.compaction_threshold = '\0';
  _Var10._M_i = (__int_type)&pfStack_1370;
  ppfStack_1398 = (fdb_kvs_handle **)0x1196d0;
  fdb_open((fdb_file_handle **)_Var10._M_i,"./iterator_test1",&fStack_fe0);
  pfVar6 = (fdb_kvs_handle *)&pfStack_1378;
  ppfStack_1398 = (fdb_kvs_handle **)0x1196e3;
  fdb_kvs_open_default(pfStack_1370,(fdb_kvs_handle **)pfVar6,(fdb_kvs_config *)doc._M_i);
  ppfStack_1398 = (fdb_kvs_handle **)0x1196f9;
  fVar4 = fdb_set_log_callback(pfStack_1378,logCallbackFunc,"iterator_seek_wal_only_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_1398 = (fdb_kvs_handle **)0x11971f;
    fVar4 = fdb_kvs_open(pfStack_1370,&pfStack_1368,"kv1",(fdb_kvs_config *)auStack_1308);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a282;
    unaff_R12.end_seqnum = 0;
    pfVar13 = (fdb_kvs_handle *)0x0;
    do {
      ppfStack_1398 = (fdb_kvs_handle **)0x119747;
      sprintf((char *)&fStack_12e0,"kEy%d",(ulong)pfVar13 & 0xffffffff);
      ppfStack_1398 = (fdb_kvs_handle **)0x11975f;
      sprintf((char *)&fStack_12e0.bub_ctx.handle,"mEta%d",(ulong)pfVar13 & 0xffffffff);
      ppfStack_1398 = (fdb_kvs_handle **)0x119777;
      sprintf((char *)&fStack_12e0.config.encryption_key,"bOdy%d",(ulong)pfVar13 & 0xffffffff);
      _Var10._M_i = (long)aaStack_1360 + unaff_R12.end_seqnum;
      ppfStack_1398 = (fdb_kvs_handle **)0x119787;
      unaff_R13 = (fdb_kvs_handle **)strlen((char *)&fStack_12e0);
      unaff_RBP = &fStack_12e0.bub_ctx.handle;
      ppfStack_1398 = (fdb_kvs_handle **)0x11979a;
      doc._M_i = strlen((char *)unaff_RBP);
      ppfStack_1398 = (fdb_kvs_handle **)0x1197aa;
      sVar7 = strlen((char *)&fStack_12e0.config.encryption_key);
      ppfStack_1398 = (fdb_kvs_handle **)0x1197cf;
      fdb_doc_create((fdb_doc **)_Var10._M_i,&fStack_12e0,(size_t)unaff_R13,unaff_RBP,doc._M_i,
                     &fStack_12e0.config.encryption_key,sVar7);
      ppfStack_1398 = (fdb_kvs_handle **)0x1197de;
      fVar4 = fdb_set(pfStack_1368,(fdb_doc *)aaStack_1360[(long)pfVar13]);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        ppfStack_1398 = (fdb_kvs_handle **)0x11a231;
        iterator_seek_wal_only_test();
        goto LAB_0011a231;
      }
      ppfStack_1398 = (fdb_kvs_handle **)0x1197f0;
      fdb_doc_free((fdb_doc *)aaStack_1360[(long)pfVar13]);
      pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (pfVar13 != (fdb_kvs_handle *)0xa);
    unaff_R12.end_seqnum = 0;
    uVar27 = 0;
    do {
      ppfStack_1398 = (fdb_kvs_handle **)0x119821;
      sprintf((char *)&fStack_12e0,"key%d",uVar27 & 0xffffffff);
      ppfStack_1398 = (fdb_kvs_handle **)0x119839;
      sprintf((char *)&fStack_12e0.bub_ctx.handle,"meta%d",uVar27 & 0xffffffff);
      ppfStack_1398 = (fdb_kvs_handle **)0x119851;
      sprintf((char *)&fStack_12e0.config.encryption_key,"body%d",uVar27 & 0xffffffff);
      _Var10._M_i = (long)aaStack_1360 + unaff_R12.end_seqnum;
      ppfStack_1398 = (fdb_kvs_handle **)0x119861;
      unaff_R13 = (fdb_kvs_handle **)strlen((char *)&fStack_12e0);
      unaff_RBP = &fStack_12e0.bub_ctx.handle;
      ppfStack_1398 = (fdb_kvs_handle **)0x119874;
      doc._M_i = strlen((char *)unaff_RBP);
      ppfStack_1398 = (fdb_kvs_handle **)0x119884;
      sVar7 = strlen((char *)&fStack_12e0.config.encryption_key);
      ppfStack_1398 = (fdb_kvs_handle **)0x1198a9;
      fdb_doc_create((fdb_doc **)_Var10._M_i,&fStack_12e0,(size_t)unaff_R13,unaff_RBP,doc._M_i,
                     &fStack_12e0.config.encryption_key,sVar7);
      ppfStack_1398 = (fdb_kvs_handle **)0x1198b8;
      fdb_set(pfStack_1378,(fdb_doc *)aaStack_1360[uVar27]);
      uVar27 = uVar27 + 1;
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (uVar27 != 10);
    ppfStack_1398 = (fdb_kvs_handle **)0x1198d5;
    fdb_commit(pfStack_1370,'\0');
    ppfStack_1398 = (fdb_kvs_handle **)0x1198f8;
    fdb_iterator_init(pfStack_1378,(fdb_iterator **)(auStack_1388 + 8),(void *)0x0,0,(void *)0x0,0,0
                     );
    ppfStack_1398 = (fdb_kvs_handle **)0x119905;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    aVar23 = aaStack_1360[0];
    pfVar13 = (fdb_kvs_handle *)auStack_1388._0_8_;
    pfVar6 = (fdb_kvs_handle *)(auStack_1388 + 8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a287;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[0].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x11992e;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    if (iVar5 != 0) goto LAB_0011a28c;
    doc._M_i = *(__int_type *)((long)pfVar13 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aVar23.end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x11994e;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a297;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(aVar23.end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x11996e;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp_param
                );
    if (iVar5 != 0) goto LAB_0011a2a2;
    ppfStack_1398 = (fdb_kvs_handle **)0x11997e;
    fdb_doc_free((fdb_doc *)pfVar13);
    pfVar13 = (fdb_kvs_handle *)auStack_1388._8_8_;
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    doc._M_i = (((atomic<unsigned_long> *)(aaStack_1360[2].end_seqnum + 0x20))->
               super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x1199a2;
    sVar7 = strlen((char *)&fStack_12e0);
    ppfStack_1398 = (fdb_kvs_handle **)0x1199b2;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar13,(void *)doc._M_i,sVar7,'\0');
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a2ad;
    ppfStack_1398 = (fdb_kvs_handle **)0x1199ca;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    aVar24 = aaStack_1360[2];
    pfVar6 = (fdb_kvs_handle *)auStack_1388._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a2b2;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[2].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x1199f3;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    if (iVar5 != 0) goto LAB_0011a2b7;
    doc._M_i = *(__int_type *)((long)pfVar6 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aVar24.end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x119a13;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar6->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a2c2;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar6 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(aVar24.end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119a33;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar6->kvs_config).custom_cmp_param)
    ;
    if (iVar5 != 0) goto LAB_0011a2cd;
    ppfStack_1398 = (fdb_kvs_handle **)0x119a43;
    fdb_doc_free((fdb_doc *)pfVar6);
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    ppfStack_1398 = (fdb_kvs_handle **)0x119a56;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1388._8_8_);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a2d8;
    ppfStack_1398 = (fdb_kvs_handle **)0x119a6e;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    aVar23 = aaStack_1360[3];
    pfVar13 = (fdb_kvs_handle *)auStack_1388._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a2dd;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[3].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119a97;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    if (iVar5 != 0) goto LAB_0011a2e2;
    doc._M_i = *(__int_type *)((long)pfVar13 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aVar23.end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x119ab7;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a2ed;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(aVar23.end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119ad7;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp_param
                );
    if (iVar5 != 0) goto LAB_0011a2f8;
    ppfStack_1398 = (fdb_kvs_handle **)0x119ae7;
    fdb_doc_free((fdb_doc *)pfVar13);
    pfVar13 = (fdb_kvs_handle *)auStack_1388._8_8_;
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    doc._M_i = (((atomic<unsigned_long> *)(aaStack_1360[9].end_seqnum + 0x20))->
               super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119b0b;
    sVar7 = strlen((char *)&fStack_12e0);
    ppfStack_1398 = (fdb_kvs_handle **)0x119b1b;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar13,(void *)doc._M_i,sVar7,'\0');
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a303;
    ppfStack_1398 = (fdb_kvs_handle **)0x119b33;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    aVar24 = aaStack_1360[9];
    pfVar6 = (fdb_kvs_handle *)auStack_1388._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a308;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[9].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119b5c;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    if (iVar5 != 0) goto LAB_0011a30d;
    doc._M_i = *(__int_type *)((long)pfVar6 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aVar24.end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x119b7c;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar6->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a318;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar6 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(aVar24.end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119b9c;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar6->kvs_config).custom_cmp_param)
    ;
    if (iVar5 != 0) goto LAB_0011a323;
    ppfStack_1398 = (fdb_kvs_handle **)0x119bac;
    fdb_doc_free((fdb_doc *)pfVar6);
    pfVar6 = (fdb_kvs_handle *)auStack_1388._8_8_;
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    doc._M_i = (((atomic<unsigned_long> *)(aaStack_1360[0].end_seqnum + 0x20))->
               super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119bd0;
    sVar7 = strlen((char *)&fStack_12e0);
    ppfStack_1398 = (fdb_kvs_handle **)0x119be0;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar6,(void *)doc._M_i,sVar7,'\0');
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a32e;
    ppfStack_1398 = (fdb_kvs_handle **)0x119bf8;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    unaff_R12 = aaStack_1360[0];
    pfVar13 = (fdb_kvs_handle *)auStack_1388._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a333;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[0].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119c21;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    if (iVar5 != 0) goto LAB_0011a338;
    doc._M_i = *(__int_type *)((long)pfVar13 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(unaff_R12.end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x119c41;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a343;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(unaff_R12.end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119c61;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp_param
                );
    if (iVar5 != 0) goto LAB_0011a34e;
    ppfStack_1398 = (fdb_kvs_handle **)0x119c71;
    fdb_doc_free((fdb_doc *)pfVar13);
    pfVar13 = (fdb_kvs_handle *)auStack_1388._8_8_;
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    doc._M_i = (((atomic<unsigned_long> *)(aaStack_1360[2].end_seqnum + 0x20))->
               super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119c95;
    sVar7 = strlen((char *)&fStack_12e0);
    ppfStack_1398 = (fdb_kvs_handle **)0x119ca5;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar13,(void *)doc._M_i,sVar7,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a359;
    unaff_R13 = (fdb_kvs_handle **)0x2;
    pfVar13 = (fdb_kvs_handle *)auStack_1388;
    _Var25._M_i = doc._M_i;
    do {
      ppfStack_1398 = (fdb_kvs_handle **)0x119cc5;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)pfVar13);
      doc._M_i = auStack_1388._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a23c;
      _Var10._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
      unaff_RBP = (fdb_kvs_handle **)aaStack_1360[(long)unaff_R13].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
      ppfStack_1398 = (fdb_kvs_handle **)0x119ced;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,
                   *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
      if (iVar5 != 0) goto LAB_0011a231;
      _Var10._M_i = *(__int_type *)(doc._M_i + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
      ppfStack_1398 = (fdb_kvs_handle **)0x119d0c;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,
                   (size_t)((fdb_kvs_config *)doc._M_i)->custom_cmp);
      pfVar6 = pfVar13;
      if (iVar5 != 0) goto LAB_0011a24c;
      _Var10._M_i = (__int_type)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(doc._M_i + 0x40))->seqtree;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
      ppfStack_1398 = (fdb_kvs_handle **)0x119d2b;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,
                   (size_t)((fdb_kvs_config *)doc._M_i)->custom_cmp_param);
      if (iVar5 != 0) goto LAB_0011a241;
      ppfStack_1398 = (fdb_kvs_handle **)0x119d3b;
      fdb_doc_free((fdb_doc *)doc._M_i);
      auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
      unaff_R13 = (fdb_kvs_handle **)((long)unaff_R13 + 1);
      ppfStack_1398 = (fdb_kvs_handle **)0x119d51;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1388._8_8_);
      pfVar6 = (fdb_kvs_handle *)auStack_1388._8_8_;
      _Var25._M_i = doc._M_i;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (unaff_R13 != (fdb_kvs_handle **)0xa) goto LAB_0011a35e;
    doc._M_i = (((atomic<unsigned_long> *)(aaStack_1360[3].end_seqnum + 0x20))->
               super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119d7f;
    sVar7 = strlen((char *)&fStack_12e0);
    ppfStack_1398 = (fdb_kvs_handle **)0x119d8f;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar6,(void *)doc._M_i,sVar7,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a363;
    unaff_R13 = (fdb_kvs_handle **)0x3;
    pfVar6 = (fdb_kvs_handle *)auStack_1388;
    _Var25._M_i = doc._M_i;
    do {
      ppfStack_1398 = (fdb_kvs_handle **)0x119daf;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)pfVar6);
      doc._M_i = auStack_1388._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a262;
      _Var10._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
      unaff_RBP = (fdb_kvs_handle **)aaStack_1360[(long)unaff_R13].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
      ppfStack_1398 = (fdb_kvs_handle **)0x119dd7;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,
                   *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
      if (iVar5 != 0) goto LAB_0011a257;
      _Var10._M_i = *(__int_type *)(doc._M_i + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
      ppfStack_1398 = (fdb_kvs_handle **)0x119df6;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,
                   (size_t)((fdb_kvs_config *)doc._M_i)->custom_cmp);
      if (iVar5 != 0) goto LAB_0011a272;
      _Var10._M_i = (__int_type)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(doc._M_i + 0x40))->seqtree;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
      ppfStack_1398 = (fdb_kvs_handle **)0x119e15;
      iVar5 = bcmp((void *)_Var10._M_i,(void *)unaff_R12,
                   (size_t)((fdb_kvs_config *)doc._M_i)->custom_cmp_param);
      if (iVar5 != 0) goto LAB_0011a267;
      ppfStack_1398 = (fdb_kvs_handle **)0x119e25;
      fdb_doc_free((fdb_doc *)doc._M_i);
      auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
      unaff_R13 = (fdb_kvs_handle **)((long)unaff_R13 + 1);
      ppfStack_1398 = (fdb_kvs_handle **)0x119e3b;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1388._8_8_);
      _Var25._M_i = doc._M_i;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (unaff_R13 != (fdb_kvs_handle **)0xa) goto LAB_0011a368;
    pfVar6 = (fdb_kvs_handle *)(auStack_1388 + 8);
    ppfStack_1398 = (fdb_kvs_handle **)0x119e5b;
    fdb_iterator_close((fdb_iterator *)auStack_1388._8_8_);
    doc._M_i = (__int_type)&fStack_12e0;
    ppfStack_1398 = (fdb_kvs_handle **)0x119e7c;
    sprintf((char *)doc._M_i,"key%d",4);
    unaff_R12.end_seqnum = (fdb_seqnum_t)&fStack_12e0.bub_ctx.handle;
    ppfStack_1398 = (fdb_kvs_handle **)0x119e96;
    sprintf((char *)unaff_R12,"key%d",8);
    _Var10._M_i = (__int_type)pfStack_1378;
    ppfStack_1398 = (fdb_kvs_handle **)0x119ea3;
    unaff_R13 = (fdb_kvs_handle **)strlen((char *)doc._M_i);
    ppfStack_1398 = (fdb_kvs_handle **)0x119eae;
    sVar7 = strlen((char *)unaff_R12);
    ppfStack_1398 = (fdb_kvs_handle **)0x119ecc;
    fVar4 = fdb_iterator_init((fdb_kvs_handle *)_Var10._M_i,(fdb_iterator **)pfVar6,(void *)doc._M_i
                              ,(size_t)unaff_R13,(void *)unaff_R12,sVar7,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a36d;
    ppfStack_1398 = (fdb_kvs_handle **)0x119ede;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_1388._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a372;
    ppfStack_1398 = (fdb_kvs_handle **)0x119ef5;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    pfVar13 = (fdb_kvs_handle *)auStack_1388._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a377;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[8].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119f1e;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    unaff_R12 = aaStack_1360[8];
    if (iVar5 != 0) goto LAB_0011a37c;
    doc._M_i = *(__int_type *)((long)pfVar13 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aaStack_1360[8].end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x119f3e;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a387;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[8].end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119f5e;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp_param
                );
    if (iVar5 != 0) goto LAB_0011a392;
    ppfStack_1398 = (fdb_kvs_handle **)0x119f6e;
    fdb_doc_free((fdb_doc *)pfVar13);
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    ppfStack_1398 = (fdb_kvs_handle **)0x119f81;
    fVar4 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_1388._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a39d;
    ppfStack_1398 = (fdb_kvs_handle **)0x119f98;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    pfVar6 = (fdb_kvs_handle *)auStack_1388._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3a2;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[4].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x119fc1;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    unaff_R12 = aaStack_1360[4];
    if (iVar5 != 0) goto LAB_0011a3a7;
    doc._M_i = *(__int_type *)((long)pfVar6 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aaStack_1360[4].end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x119fe1;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar6->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a3b2;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar6 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[4].end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a001;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar6->kvs_config).custom_cmp_param)
    ;
    if (iVar5 != 0) goto LAB_0011a3bd;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a011;
    fdb_doc_free((fdb_doc *)pfVar6);
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a024;
    fVar4 = fdb_iterator_close((fdb_iterator *)auStack_1388._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3c8;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a04c;
    fVar4 = fdb_iterator_init(pfStack_1378,(fdb_iterator **)(auStack_1388 + 8),(void *)0x0,0,
                              (void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3cd;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a05e;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_1388._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3d2;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a075;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    pfVar13 = (fdb_kvs_handle *)auStack_1388._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3d7;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[9].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a09e;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    unaff_R12 = aaStack_1360[9];
    if (iVar5 != 0) goto LAB_0011a3dc;
    doc._M_i = *(__int_type *)((long)pfVar13 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aaStack_1360[9].end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a0be;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a3e7;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[9].end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a0de;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar13->kvs_config).custom_cmp_param
                );
    if (iVar5 != 0) goto LAB_0011a3f2;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a0ee;
    fdb_doc_free((fdb_doc *)pfVar13);
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a101;
    fVar4 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_1388._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3fd;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a118;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1388._8_8_,(fdb_doc **)auStack_1388);
    pfVar6 = (fdb_kvs_handle *)auStack_1388._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a402;
    doc._M_i = *(__int_type *)(auStack_1388._0_8_ + 0x20);
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[0].end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a141;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,
                 *(size_t *)(fdb_kvs_config *)auStack_1388._0_8_);
    unaff_R12 = aaStack_1360[0];
    if (iVar5 != 0) goto LAB_0011a407;
    doc._M_i = *(__int_type *)((long)pfVar6 + 0x38);
    _Var10._M_i = *(__int_type *)&((kvs_ops_stat *)(aaStack_1360[0].end_seqnum + 0x38))->num_sets;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a161;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar6->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a412;
    doc._M_i = (__int_type)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar6 + 0x40))->seqtree;
    _Var10._M_i = (((atomic<unsigned_long> *)(aaStack_1360[0].end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a181;
    iVar5 = bcmp((void *)doc._M_i,(void *)_Var10._M_i,(size_t)(pfVar6->kvs_config).custom_cmp_param)
    ;
    if (iVar5 != 0) goto LAB_0011a41d;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a191;
    fdb_doc_free((fdb_doc *)pfVar6);
    auStack_1388._0_8_ = (fdb_kvs_handle *)0x0;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a1a4;
    fVar4 = fdb_iterator_close((fdb_iterator *)auStack_1388._8_8_);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      ppfStack_1398 = (fdb_kvs_handle **)0x11a1b6;
      fdb_kvs_close(pfStack_1368);
      ppfStack_1398 = (fdb_kvs_handle **)0x11a1c0;
      fdb_kvs_close(pfStack_1378);
      ppfStack_1398 = (fdb_kvs_handle **)0x11a1ca;
      fdb_close(pfStack_1370);
      lVar22 = 0;
      do {
        ppfStack_1398 = (fdb_kvs_handle **)0x11a1d6;
        fdb_doc_free((fdb_doc *)aaStack_1360[lVar22]);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 10);
      ppfStack_1398 = (fdb_kvs_handle **)0x11a1e4;
      fdb_shutdown();
      ppfStack_1398 = (fdb_kvs_handle **)0x11a1e9;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_seek_wal_only_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      ppfStack_1398 = (fdb_kvs_handle **)0x11a21a;
      fprintf(_stderr,pcVar21,"iterator seek wal only test");
      return;
    }
  }
  else {
LAB_0011a27d:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a282;
    iterator_seek_wal_only_test();
LAB_0011a282:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a287;
    iterator_seek_wal_only_test();
LAB_0011a287:
    aVar23 = unaff_R12;
    pfVar13 = pfVar6;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a28c;
    iterator_seek_wal_only_test();
LAB_0011a28c:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a297;
    iterator_seek_wal_only_test();
LAB_0011a297:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2a2;
    iterator_seek_wal_only_test();
LAB_0011a2a2:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2ad;
    iterator_seek_wal_only_test();
LAB_0011a2ad:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2b2;
    iterator_seek_wal_only_test();
LAB_0011a2b2:
    aVar24 = aVar23;
    pfVar6 = pfVar13;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2b7;
    iterator_seek_wal_only_test();
LAB_0011a2b7:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2c2;
    iterator_seek_wal_only_test();
LAB_0011a2c2:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2cd;
    iterator_seek_wal_only_test();
LAB_0011a2cd:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2d8;
    iterator_seek_wal_only_test();
LAB_0011a2d8:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2dd;
    iterator_seek_wal_only_test();
LAB_0011a2dd:
    aVar23 = aVar24;
    pfVar13 = pfVar6;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2e2;
    iterator_seek_wal_only_test();
LAB_0011a2e2:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2ed;
    iterator_seek_wal_only_test();
LAB_0011a2ed:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a2f8;
    iterator_seek_wal_only_test();
LAB_0011a2f8:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a303;
    iterator_seek_wal_only_test();
LAB_0011a303:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a308;
    iterator_seek_wal_only_test();
LAB_0011a308:
    aVar24 = aVar23;
    pfVar6 = pfVar13;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a30d;
    iterator_seek_wal_only_test();
LAB_0011a30d:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a318;
    iterator_seek_wal_only_test();
LAB_0011a318:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a323;
    iterator_seek_wal_only_test();
LAB_0011a323:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a32e;
    iterator_seek_wal_only_test();
LAB_0011a32e:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a333;
    iterator_seek_wal_only_test();
LAB_0011a333:
    unaff_R12 = aVar24;
    pfVar13 = pfVar6;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a338;
    iterator_seek_wal_only_test();
LAB_0011a338:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a343;
    iterator_seek_wal_only_test();
LAB_0011a343:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a34e;
    iterator_seek_wal_only_test();
LAB_0011a34e:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a359;
    iterator_seek_wal_only_test();
LAB_0011a359:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a35e;
    iterator_seek_wal_only_test();
LAB_0011a35e:
    pfVar6 = pfVar13;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a363;
    iterator_seek_wal_only_test();
LAB_0011a363:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a368;
    iterator_seek_wal_only_test();
LAB_0011a368:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a36d;
    iterator_seek_wal_only_test();
LAB_0011a36d:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a372;
    iterator_seek_wal_only_test();
LAB_0011a372:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a377;
    iterator_seek_wal_only_test();
LAB_0011a377:
    pfVar13 = pfVar6;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a37c;
    iterator_seek_wal_only_test();
LAB_0011a37c:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a387;
    iterator_seek_wal_only_test();
LAB_0011a387:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a392;
    iterator_seek_wal_only_test();
LAB_0011a392:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a39d;
    iterator_seek_wal_only_test();
LAB_0011a39d:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3a2;
    iterator_seek_wal_only_test();
LAB_0011a3a2:
    pfVar6 = pfVar13;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3a7;
    iterator_seek_wal_only_test();
LAB_0011a3a7:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3b2;
    iterator_seek_wal_only_test();
LAB_0011a3b2:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3bd;
    iterator_seek_wal_only_test();
LAB_0011a3bd:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3c8;
    iterator_seek_wal_only_test();
LAB_0011a3c8:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3cd;
    iterator_seek_wal_only_test();
LAB_0011a3cd:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3d2;
    iterator_seek_wal_only_test();
LAB_0011a3d2:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3d7;
    iterator_seek_wal_only_test();
LAB_0011a3d7:
    pfVar13 = pfVar6;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3dc;
    iterator_seek_wal_only_test();
LAB_0011a3dc:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3e7;
    iterator_seek_wal_only_test();
LAB_0011a3e7:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3f2;
    iterator_seek_wal_only_test();
LAB_0011a3f2:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a3fd;
    iterator_seek_wal_only_test();
LAB_0011a3fd:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a402;
    iterator_seek_wal_only_test();
LAB_0011a402:
    pfVar6 = pfVar13;
    ppfStack_1398 = (fdb_kvs_handle **)0x11a407;
    iterator_seek_wal_only_test();
LAB_0011a407:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a412;
    iterator_seek_wal_only_test();
LAB_0011a412:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a41d;
    iterator_seek_wal_only_test();
LAB_0011a41d:
    ppfStack_1398 = (fdb_kvs_handle **)0x11a428;
    iterator_seek_wal_only_test();
  }
  ppfStack_1398 = (fdb_kvs_handle **)iterator_after_wal_threshold;
  iterator_seek_wal_only_test();
  pcStack_1720 = (code *)0x11a44a;
  pfStack_13c0 = pfVar6;
  aStack_13b8 = unaff_R12;
  ppfStack_13b0 = unaff_R13;
  pfStack_13a8 = (fdb_kvs_handle *)doc._M_i;
  pfStack_13a0 = (fdb_kvs_handle *)_Var10._M_i;
  ppfStack_1398 = unaff_RBP;
  gettimeofday(&tStack_16e8,(__timezone_ptr_t)0x0);
  pcStack_1720 = (code *)0x11a44f;
  memleak_start();
  pfStack_1710 = (fdb_iterator *)0x0;
  pcStack_1720 = (code *)0x11a465;
  fdb_get_default_config();
  pcStack_1720 = (code *)0x11a472;
  fdb_get_default_kvs_config();
  fStack_16c0.wal_threshold = 10;
  fStack_16c0.flags = 1;
  fStack_16c0.seqtree_opt = '\x01';
  pcStack_1720 = (code *)0x11a493;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_1720 = (code *)0x11a4aa;
  fdb_open(&pfStack_16f0,"./iterator_test1",&fStack_16c0);
  pcStack_1720 = (code *)0x11a4c1;
  fdb_kvs_open(pfStack_16f0,&pfStack_1700,"db1",&fStack_16d8);
  pcStack_1720 = (code *)0x11a4d8;
  fdb_kvs_open(pfStack_16f0,&pfStack_16f8,"db2",&fStack_16d8);
  uVar27 = 0;
  do {
    pcStack_1720 = (code *)0x11a504;
    sprintf(acStack_14c8,"key%d",uVar27);
    pcStack_1720 = (code *)0x11a513;
    sprintf(acStack_15c8,"body%d",uVar27);
    pfVar6 = pfStack_1700;
    pcStack_1720 = (code *)0x11a520;
    ppfVar11 = (fdb_iterator **)strlen(acStack_14c8);
    pcStack_1720 = (code *)0x11a52b;
    sVar7 = strlen(acStack_15c8);
    pcStack_1720 = (code *)0x11a53f;
    fdb_set_kv(pfVar6,acStack_14c8,(size_t)ppfVar11,acStack_15c8,sVar7);
    uVar18 = (int)uVar27 + 1;
    uVar27 = (ulong)uVar18;
  } while (uVar18 != 6);
  pcStack_1720 = (code *)0x11a55c;
  fVar4 = fdb_iterator_sequence_init(pfStack_1700,&pfStack_1708,0,0,0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    do {
      pcStack_1720 = (code *)0x11a576;
      fVar4 = fdb_iterator_get(pfStack_1708,(fdb_doc **)&pfStack_1710);
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011a6b9:
        pcStack_1720 = (code *)0x11a6be;
        iterator_after_wal_threshold();
        goto LAB_0011a6be;
      }
      pcStack_1720 = (code *)0x11a599;
      fVar4 = fdb_set_kv(pfStack_16f8,(void *)pfStack_1710->_seqnum,(size_t)pfStack_1710->handle,
                         (void *)0x0,0);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pcStack_1720 = (code *)0x11a6b9;
        iterator_after_wal_threshold();
        goto LAB_0011a6b9;
      }
      pcStack_1720 = (code *)0x11a5ab;
      fdb_doc_free((fdb_doc *)pfStack_1710);
      pfStack_1710 = (fdb_iterator *)0x0;
      pcStack_1720 = (code *)0x11a5be;
      fVar4 = fdb_iterator_next(pfStack_1708);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ppfVar11 = &pfStack_1708;
    pcStack_1720 = (code *)0x11a5d0;
    fdb_iterator_close(pfStack_1708);
    pcStack_1720 = (code *)0x11a5e4;
    fVar4 = fdb_iterator_sequence_init(pfStack_1700,ppfVar11,0,0,0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      while( true ) {
        pcStack_1720 = (code *)0x11a5fe;
        fVar4 = fdb_iterator_get(pfStack_1708,(fdb_doc **)&pfStack_1710);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pcStack_1720 = (code *)0x11a615;
        fVar4 = fdb_get(pfStack_1700,(fdb_doc *)pfStack_1710);
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a6be;
        pcStack_1720 = (code *)0x11a627;
        fdb_doc_free((fdb_doc *)pfStack_1710);
        pfStack_1710 = (fdb_iterator *)0x0;
        pcStack_1720 = (code *)0x11a63a;
        fVar4 = fdb_iterator_next(pfStack_1708);
        if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
          pcStack_1720 = (code *)0x11a649;
          fdb_iterator_close(pfStack_1708);
          pcStack_1720 = (code *)0x11a653;
          fdb_kvs_close(pfStack_1700);
          pcStack_1720 = (code *)0x11a65d;
          fdb_kvs_close(pfStack_16f8);
          pcStack_1720 = (code *)0x11a667;
          fdb_close(pfStack_16f0);
          pcStack_1720 = (code *)0x11a66c;
          fdb_shutdown();
          pcStack_1720 = (code *)0x11a671;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (iterator_after_wal_threshold()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pcStack_1720 = (code *)0x11a6a2;
          fprintf(_stderr,pcVar21,"iterator after wal threshold");
          return;
        }
      }
LAB_0011a6c3:
      ppfVar11 = &pfStack_1710;
      pcStack_1720 = (code *)0x11a6c8;
      iterator_after_wal_threshold();
      goto LAB_0011a6c8;
    }
  }
  else {
LAB_0011a6c8:
    pcStack_1720 = (code *)0x11a6cd;
    iterator_after_wal_threshold();
  }
  pcStack_1720 = iterator_manual_wal_flush;
  iterator_after_wal_threshold();
  pcStack_1728 = "body%d";
  pfStack_1738 = pfVar6;
  pfStack_18e8 = (fdb_kvs_handle *)0x11a6ef;
  ppfStack_1748 = ppfVar11;
  pcStack_1740 = acStack_15c8;
  pcStack_1730 = acStack_14c8;
  pcStack_1720 = (code *)uVar27;
  gettimeofday(&tStack_1868,(__timezone_ptr_t)0x0);
  pfStack_18e8 = (fdb_kvs_handle *)0x11a6f4;
  memleak_start();
  uStack_1888 = 0x3106002d;
  uStack_1890 = 0x3032343e3e0508;
  uStack_1889 = 0x31;
  uStack_1880._0_2_ = 0x508;
  uStack_1880._2_6_ = 0x313032343e3e;
  pvStack_1878 = (void *)0x323106002d31;
  uStack_1870 = 0;
  ptr_iterator = (fdb_kvs_handle **)auStack_18a0;
  auStack_18a0._0_7_ = 0x3931343e3e0508;
  auStack_18a0._7_4_ = 0x2d3939;
  uStack_18c0 = 0x3433343e3e0508;
  uStack_18b9 = 0x140a35;
  pfStack_18d0 = (fdb_kvs_handle *)0x0;
  pfStack_18e8 = (fdb_kvs_handle *)0x11a772;
  fdb_get_default_config();
  pfVar6 = (fdb_kvs_handle *)auStack_1858;
  pfStack_18e8 = (fdb_kvs_handle *)0x11a782;
  fdb_get_default_kvs_config();
  pfStack_1830 = (fdb_file_handle *)0x400;
  uStack_181c = 1;
  pfStack_18e8 = (fdb_kvs_handle *)0x11a79e;
  system("rm -rf  iterator_test* > errorlog.txt");
  pbVar12 = (btree *)&pfStack_18a8;
  pfStack_18e8 = (fdb_kvs_handle *)0x11a7b5;
  fdb_open((fdb_file_handle **)pbVar12,"./iterator_test1",(fdb_config *)(auStack_1858 + 0x18));
  ppfVar14 = &pfStack_18b0;
  pfStack_18e8 = (fdb_kvs_handle *)0x11a7d0;
  fdb_kvs_open(pfStack_18a8,ppfVar14,"db1",(fdb_kvs_config *)pfVar6);
  pfStack_18e8 = (fdb_kvs_handle *)0x11a7e8;
  fdb_kvs_open(pfStack_18a8,&pfStack_18c8,"db2",(fdb_kvs_config *)pfVar6);
  pfStack_18e8 = (fdb_kvs_handle *)0x11a7fe;
  fdb_set_kv(pfStack_18b0,&uStack_1890,0xf,(void *)0x0,0);
  pfStack_18e8 = (fdb_kvs_handle *)0x11a814;
  fdb_set_kv(pfStack_18b0,&uStack_1880,0x11,(void *)0x0,0);
  pfStack_18e8 = (fdb_kvs_handle *)0x11a81f;
  fdb_commit(pfStack_18a8,'\0');
  pfStack_18e8 = (fdb_kvs_handle *)0x11a842;
  pfVar13 = pfStack_18b0;
  fVar4 = fdb_iterator_init(pfStack_18b0,(fdb_iterator **)&pfStack_18d8,ptr_iterator,0xb,(void *)0x0
                            ,0,0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    do {
      pfStack_18e8 = (fdb_kvs_handle *)0x11a85c;
      pfVar13 = pfStack_18d8;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_18d8,(fdb_doc **)&pfStack_18d0);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_18e8 = (fdb_kvs_handle *)0x11ab69;
        iterator_manual_wal_flush();
        goto LAB_0011ab69;
      }
      pfStack_18e8 = (fdb_kvs_handle *)0x11a86e;
      fdb_doc_free((fdb_doc *)pfStack_18d0);
      pfStack_18d0 = (fdb_kvs_handle *)0x0;
      pfStack_18e8 = (fdb_kvs_handle *)0x11a881;
      fVar4 = fdb_iterator_next((fdb_iterator *)pfStack_18d8);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_18d8;
    pfStack_18e8 = (fdb_kvs_handle *)0x11a893;
    fdb_iterator_close((fdb_iterator *)pfStack_18d8);
    pfStack_18e8 = (fdb_kvs_handle *)0x11a8b7;
    pfVar13 = pfStack_18b0;
    fVar4 = fdb_iterator_init(pfStack_18b0,(fdb_iterator **)ptr_iterator,&uStack_18c0,0xb,
                              (void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab78;
    pfStack_18e8 = (fdb_kvs_handle *)0x11a8ce;
    pfVar13 = pfStack_18d8;
    fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_18d8,(fdb_doc **)&pfStack_18d0);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0011ab7d;
    ptr_iterator = &pfStack_18d8;
    pfStack_18e8 = (fdb_kvs_handle *)0x11a8e3;
    fdb_iterator_close((fdb_iterator *)pfStack_18d8);
    pfStack_18e8 = (fdb_kvs_handle *)0x11a8fc;
    fdb_set_kv(pfStack_18c8,&uStack_1890,0xf,(void *)0x0,0);
    pfStack_18e8 = (fdb_kvs_handle *)0x11a915;
    fdb_set_kv(pfStack_18c8,&uStack_1880,0x11,(void *)0x0,0);
    pfStack_18e8 = (fdb_kvs_handle *)0x11a924;
    fdb_commit(pfStack_18a8,'\x01');
    pfStack_18e8 = (fdb_kvs_handle *)0x11a948;
    pfVar13 = pfStack_18c8;
    fVar4 = fdb_iterator_init(pfStack_18c8,(fdb_iterator **)ptr_iterator,auStack_18a0,0xb,
                              (void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab82;
    do {
      pfStack_18e8 = (fdb_kvs_handle *)0x11a962;
      pfVar13 = pfStack_18d8;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_18d8,(fdb_doc **)&pfStack_18d0);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab69;
      pfStack_18e8 = (fdb_kvs_handle *)0x11a974;
      fdb_doc_free((fdb_doc *)pfStack_18d0);
      pfStack_18d0 = (fdb_kvs_handle *)0x0;
      pfStack_18e8 = (fdb_kvs_handle *)0x11a987;
      fVar4 = fdb_iterator_next((fdb_iterator *)pfStack_18d8);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_18d8;
    pfStack_18e8 = (fdb_kvs_handle *)0x11a999;
    fdb_iterator_close((fdb_iterator *)pfStack_18d8);
    pfStack_18e8 = (fdb_kvs_handle *)0x11a9bd;
    pfVar13 = pfStack_18b0;
    fVar4 = fdb_iterator_init(pfStack_18b0,(fdb_iterator **)ptr_iterator,&uStack_18c0,0xb,
                              (void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab87;
    pfStack_18e8 = (fdb_kvs_handle *)0x11a9d4;
    pfVar13 = pfStack_18d8;
    fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_18d8,(fdb_doc **)&pfStack_18d0);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0011ab8c;
    ptr_iterator = &pfStack_18d8;
    pfStack_18e8 = (fdb_kvs_handle *)0x11a9e9;
    fdb_iterator_close((fdb_iterator *)pfStack_18d8);
    pfStack_18e8 = (fdb_kvs_handle *)0x11aa0c;
    fVar4 = fdb_iterator_init(pfStack_18c8,(fdb_iterator **)ptr_iterator,(void *)0x0,0,auStack_18a0,
                              0xb,0);
    pfVar13 = pfStack_18c8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab91;
    pfStack_18e8 = (fdb_kvs_handle *)0x11aa2d;
    pfVar13 = pfStack_18d8;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfStack_18d8,auStack_18a0,0xb,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0011ab96;
    ptr_iterator = &pfStack_18d8;
    pfStack_18e8 = (fdb_kvs_handle *)0x11aa42;
    fdb_iterator_close((fdb_iterator *)pfStack_18d8);
    pfStack_18e8 = (fdb_kvs_handle *)0x11aa65;
    fVar4 = fdb_iterator_init(pfStack_18b0,(fdb_iterator **)ptr_iterator,(void *)0x0,0,&uStack_18c0,
                              0xb,0);
    pfVar13 = pfStack_18b0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab9b;
    pfStack_18e8 = (fdb_kvs_handle *)0x11aa86;
    pfVar13 = pfStack_18d8;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfStack_18d8,&uStack_18c0,0xb,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011aba0;
    pfStack_18e8 = (fdb_kvs_handle *)0x11aa9d;
    pfVar13 = pfStack_18d8;
    fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_18d8,(fdb_doc **)&pfStack_18d0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_18e8 = (fdb_kvs_handle *)0x11aaaf;
      fdb_doc_free((fdb_doc *)pfStack_18d0);
      pfStack_18d0 = (fdb_kvs_handle *)0x0;
      pfStack_18e8 = (fdb_kvs_handle *)0x11aac2;
      fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_18d8);
      if (fVar4 != FDB_RESULT_ITERATOR_FAIL) {
        do {
          pfStack_18e8 = (fdb_kvs_handle *)0x11aad9;
          pfVar13 = pfStack_18d8;
          fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_18d8,(fdb_doc **)&pfStack_18d0);
          if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab6e;
          pfStack_18e8 = (fdb_kvs_handle *)0x11aaeb;
          fdb_doc_free((fdb_doc *)pfStack_18d0);
          pfStack_18d0 = (fdb_kvs_handle *)0x0;
          pfStack_18e8 = (fdb_kvs_handle *)0x11aafe;
          fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_18d8);
        } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
      }
      pfStack_18e8 = (fdb_kvs_handle *)0x11ab0d;
      fdb_iterator_close((fdb_iterator *)pfStack_18d8);
      pfStack_18e8 = (fdb_kvs_handle *)0x11ab17;
      fdb_close(pfStack_18a8);
      pfStack_18e8 = (fdb_kvs_handle *)0x11ab1c;
      fdb_shutdown();
      pfStack_18e8 = (fdb_kvs_handle *)0x11ab21;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_manual_wal_flush()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_18e8 = (fdb_kvs_handle *)0x11ab52;
      fprintf(_stderr,pcVar21,"iterator manual wal flush");
      return;
    }
  }
  else {
LAB_0011ab73:
    pfStack_18e8 = (fdb_kvs_handle *)0x11ab78;
    iterator_manual_wal_flush();
LAB_0011ab78:
    pfStack_18e8 = (fdb_kvs_handle *)0x11ab7d;
    iterator_manual_wal_flush();
LAB_0011ab7d:
    pfStack_18e8 = (fdb_kvs_handle *)0x11ab82;
    iterator_manual_wal_flush();
LAB_0011ab82:
    pfStack_18e8 = (fdb_kvs_handle *)0x11ab87;
    iterator_manual_wal_flush();
LAB_0011ab87:
    pfStack_18e8 = (fdb_kvs_handle *)0x11ab8c;
    iterator_manual_wal_flush();
LAB_0011ab8c:
    pfStack_18e8 = (fdb_kvs_handle *)0x11ab91;
    iterator_manual_wal_flush();
LAB_0011ab91:
    pfStack_18e8 = (fdb_kvs_handle *)0x11ab96;
    iterator_manual_wal_flush();
LAB_0011ab96:
    pfStack_18e8 = (fdb_kvs_handle *)0x11ab9b;
    iterator_manual_wal_flush();
LAB_0011ab9b:
    pfStack_18e8 = (fdb_kvs_handle *)0x11aba0;
    iterator_manual_wal_flush();
LAB_0011aba0:
    pfStack_18e8 = (fdb_kvs_handle *)0x11aba5;
    iterator_manual_wal_flush();
  }
  pfStack_18e8 = (fdb_kvs_handle *)sequence_iterator_seek_test;
  iterator_manual_wal_flush();
  ptr_iterator_00 = (fdb_config **)((ulong)pfVar13 & 0xffffffff);
  pfStack_1db0 = (fdb_kvs_handle *)0x11abcf;
  ppfStack_1910 = ptr_iterator;
  pbStack_1908 = pbVar12;
  ppfStack_1900 = ppfVar14;
  puStack_18f8 = &uStack_1880;
  puStack_18f0 = &uStack_1890;
  pfStack_18e8 = pfVar6;
  gettimeofday(&tStack_1d18,(__timezone_ptr_t)0x0);
  pfStack_1db0 = (fdb_kvs_handle *)0x11abd4;
  memleak_start();
  pfStack_1d98 = (fdb_config *)0x0;
  pfStack_1db0 = (fdb_kvs_handle *)0x11abe5;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar17 = &fStack_1a08;
  pfStack_1db0 = (fdb_kvs_handle *)0x11abf5;
  fdb_get_default_config();
  pfStack_1db0 = (fdb_kvs_handle *)0x11abff;
  fdb_get_default_kvs_config();
  fStack_1a08.buffercache_size = 0;
  fStack_1a08.wal_threshold = 0x400;
  fStack_1a08.seqtree_opt = '\x01';
  fStack_1a08.flags = 1;
  fStack_1a08.multi_kv_instances = SUB81(ptr_iterator_00,0);
  fStack_1a08.compaction_threshold = '\0';
  ptr_fhandle = &pfStack_1d88;
  pfStack_1db0 = (fdb_kvs_handle *)0x11ac38;
  fdb_open(ptr_fhandle,"./iterator_test7",pfVar17);
  if ((int)pfVar13 == 0) {
    pfStack_1db0 = (fdb_kvs_handle *)0x11ac66;
    fdb_kvs_open_default(pfStack_1d88,&pfStack_1d90,&fStack_1d80);
  }
  else {
    pfStack_1db0 = (fdb_kvs_handle *)0x11ac55;
    fdb_kvs_open(pfStack_1d88,&pfStack_1d90,"kv1",&fStack_1d80);
  }
  pfStack_1db0 = (fdb_kvs_handle *)0x11ac7e;
  fVar4 = fdb_set_log_callback(pfStack_1d90,logCallbackFunc,"sequence_iterator_seek_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar22 = 0;
    uVar27 = 0;
    do {
      pfVar1 = &fStack_1d08.config.encryption_key;
      pfStack_1db0 = (fdb_kvs_handle *)0x11aca6;
      sprintf((char *)pfVar1,"key%d",uVar27 & 0xffffffff);
      pfStack_1db0 = (fdb_kvs_handle *)0x11acbe;
      sprintf((char *)&fStack_1d08.bub_ctx.handle,"meta%d",uVar27 & 0xffffffff);
      pfStack_1db0 = (fdb_kvs_handle *)0x11acd6;
      sprintf((char *)&fStack_1d08,"body%d",uVar27 & 0xffffffff);
      pfStack_1db0 = (fdb_kvs_handle *)0x11ace6;
      sVar7 = strlen((char *)pfVar1);
      ppfVar14 = &fStack_1d08.bub_ctx.handle;
      pfStack_1db0 = (fdb_kvs_handle *)0x11acf9;
      sVar8 = strlen((char *)ppfVar14);
      pfStack_1db0 = (fdb_kvs_handle *)0x11ad09;
      sVar9 = strlen((char *)&fStack_1d08);
      pfStack_1db0 = (fdb_kvs_handle *)0x11ad2e;
      fdb_doc_create((fdb_doc **)((long)apfStack_1d68 + lVar22),&fStack_1d08.config.encryption_key,
                     sVar7,ppfVar14,sVar8,&fStack_1d08,sVar9);
      pfStack_1db0 = (fdb_kvs_handle *)0x11ad3d;
      fdb_set(pfStack_1d90,apfStack_1d68[uVar27]);
      uVar27 = uVar27 + 1;
      lVar22 = lVar22 + 8;
    } while (uVar27 != 5);
    pfStack_1db0 = (fdb_kvs_handle *)0x11ad5d;
    fdb_commit(pfStack_1d88,'\x01');
    uVar27 = 5;
    pfVar17 = (fdb_config *)apfStack_1d40;
    do {
      pfVar1 = &fStack_1d08.config.encryption_key;
      pfStack_1db0 = (fdb_kvs_handle *)0x11ad82;
      sprintf((char *)pfVar1,"key%d",uVar27 & 0xffffffff);
      ppfVar14 = &fStack_1d08.bub_ctx.handle;
      pfStack_1db0 = (fdb_kvs_handle *)0x11ad9d;
      sprintf((char *)ppfVar14,"meta%d",uVar27 & 0xffffffff);
      pfVar6 = &fStack_1d08;
      pfStack_1db0 = (fdb_kvs_handle *)0x11adb8;
      sprintf((char *)pfVar6,"body%d",uVar27 & 0xffffffff);
      pfStack_1db0 = (fdb_kvs_handle *)0x11adc0;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar1);
      pfStack_1db0 = (fdb_kvs_handle *)0x11adcb;
      pbVar12 = (btree *)strlen((char *)ppfVar14);
      pfStack_1db0 = (fdb_kvs_handle *)0x11add6;
      sVar7 = strlen((char *)pfVar6);
      pfStack_1db0 = (fdb_kvs_handle *)0x11adf6;
      fdb_doc_create((fdb_doc **)pfVar17,&fStack_1d08.config.encryption_key,(size_t)ptr_fhandle,
                     ppfVar14,(size_t)pbVar12,pfVar6,sVar7);
      pfStack_1db0 = (fdb_kvs_handle *)0x11ae03;
      fdb_set(pfStack_1d90,(fdb_doc *)*(fdb_kvs_handle **)pfVar17);
      uVar27 = uVar27 + 1;
      pfVar17 = (fdb_config *)((long)pfVar17 + 8);
    } while (uVar27 != 10);
    pfStack_1db0 = (fdb_kvs_handle *)0x11ae20;
    fdb_commit(pfStack_1d88,'\0');
    ptr_iterator_00 = &pfStack_1da0;
    pfStack_1db0 = (fdb_kvs_handle *)0x11ae39;
    fdb_iterator_sequence_init(pfStack_1d90,(fdb_iterator **)ptr_iterator_00,0,0,0);
    pfStack_1db0 = (fdb_kvs_handle *)0x11ae41;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_1da0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b1b2;
    ppfVar14 = apfStack_1d40 + 4;
    pfVar26 = pfVar17;
    do {
      pfStack_1db0 = (fdb_kvs_handle *)0x11ae63;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_1da0,(fdb_doc **)&pfStack_1d98);
      pfVar17 = pfStack_1d98;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011b146:
        pfStack_1db0 = (fdb_kvs_handle *)0x11b14b;
        sequence_iterator_seek_test();
        pfVar17 = pfVar26;
LAB_0011b14b:
        pfStack_1db0 = (fdb_kvs_handle *)0x11b156;
        sequence_iterator_seek_test();
LAB_0011b156:
        pfStack_1db0 = (fdb_kvs_handle *)0x11b161;
        sequence_iterator_seek_test();
        goto LAB_0011b161;
      }
      sVar7._0_2_ = pfStack_1d98->chunksize;
      sVar7._2_2_ = *(undefined2 *)&pfStack_1d98->field_0x2;
      sVar7._4_4_ = pfStack_1d98->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_1d98->seqtree_opt;
      pfVar6 = *ppfVar14;
      pbVar12 = (btree *)pfVar6->op_stats;
      pfStack_1db0 = (fdb_kvs_handle *)0x11ae8a;
      iVar5 = bcmp(ptr_fhandle,pbVar12,sVar7);
      pfVar26 = pfVar17;
      if (iVar5 != 0) {
        pfStack_1db0 = (fdb_kvs_handle *)0x11b146;
        sequence_iterator_seek_test();
        goto LAB_0011b146;
      }
      ptr_fhandle = (fdb_file_handle **)pfVar17->compactor_sleep_duration;
      pbVar12 = pfVar6->staletree;
      pfStack_1db0 = (fdb_kvs_handle *)0x11aea9;
      iVar5 = bcmp(ptr_fhandle,pbVar12,pfVar17->buffercache_size);
      if (iVar5 != 0) goto LAB_0011b156;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar17->multi_kv_instances;
      pbVar12 = (pfVar6->field_6).seqtree;
      pfStack_1db0 = (fdb_kvs_handle *)0x11aec8;
      iVar5 = bcmp(ptr_fhandle,pbVar12,pfVar17->wal_threshold);
      if (iVar5 != 0) goto LAB_0011b14b;
      pfStack_1db0 = (fdb_kvs_handle *)0x11aed8;
      fdb_doc_free((fdb_doc *)pfVar17);
      pfStack_1d98 = (fdb_config *)0x0;
      pfStack_1db0 = (fdb_kvs_handle *)0x11aeeb;
      fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_1da0);
      ppfVar14 = ppfVar14 + -1;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_1da0;
    pfStack_1db0 = (fdb_kvs_handle *)0x11af05;
    fdb_iterator_close((fdb_iterator *)pfStack_1da0);
    pfStack_1db0 = (fdb_kvs_handle *)0x11af1c;
    fdb_iterator_sequence_init(pfStack_1d90,(fdb_iterator **)ptr_iterator_00,0,7,0);
    pfStack_1db0 = (fdb_kvs_handle *)0x11af24;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_1da0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b1b7;
    ppfVar14 = apfStack_1d40 + 1;
    do {
      pfStack_1db0 = (fdb_kvs_handle *)0x11af43;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_1da0,(fdb_doc **)&pfStack_1d98);
      pfVar17 = pfStack_1d98;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b16c;
      sVar8._0_2_ = pfStack_1d98->chunksize;
      sVar8._2_2_ = *(undefined2 *)&pfStack_1d98->field_0x2;
      sVar8._4_4_ = pfStack_1d98->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_1d98->seqtree_opt;
      pfVar6 = *ppfVar14;
      pbVar12 = (btree *)pfVar6->op_stats;
      pfStack_1db0 = (fdb_kvs_handle *)0x11af6a;
      iVar5 = bcmp(ptr_fhandle,pbVar12,sVar8);
      if (iVar5 != 0) goto LAB_0011b161;
      ptr_fhandle = (fdb_file_handle **)pfVar17->compactor_sleep_duration;
      pbVar12 = pfVar6->staletree;
      pfStack_1db0 = (fdb_kvs_handle *)0x11af89;
      iVar5 = bcmp(ptr_fhandle,pbVar12,pfVar17->buffercache_size);
      if (iVar5 != 0) goto LAB_0011b17c;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar17->multi_kv_instances;
      pbVar12 = (pfVar6->field_6).seqtree;
      pfStack_1db0 = (fdb_kvs_handle *)0x11afa8;
      iVar5 = bcmp(ptr_fhandle,pbVar12,pfVar17->wal_threshold);
      if (iVar5 != 0) goto LAB_0011b171;
      pfStack_1db0 = (fdb_kvs_handle *)0x11afb8;
      fdb_doc_free((fdb_doc *)pfVar17);
      pfStack_1d98 = (fdb_config *)0x0;
      pfStack_1db0 = (fdb_kvs_handle *)0x11afcb;
      fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_1da0);
      ppfVar14 = ppfVar14 + -1;
      pfVar26 = pfVar17;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_1da0;
    pfStack_1db0 = (fdb_kvs_handle *)0x11afe5;
    fdb_iterator_close((fdb_iterator *)pfStack_1da0);
    pfStack_1db0 = (fdb_kvs_handle *)0x11afff;
    fdb_iterator_sequence_init(pfStack_1d90,(fdb_iterator **)ptr_iterator_00,0,7,8);
    pfStack_1db0 = (fdb_kvs_handle *)0x11b007;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_1da0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      ppfVar14 = apfStack_1d40;
      while( true ) {
        pfStack_1db0 = (fdb_kvs_handle *)0x11b026;
        fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_1da0,(fdb_doc **)&pfStack_1d98);
        pfVar17 = pfStack_1d98;
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        sVar9._0_2_ = pfStack_1d98->chunksize;
        sVar9._2_2_ = *(undefined2 *)&pfStack_1d98->field_0x2;
        sVar9._4_4_ = pfStack_1d98->blocksize;
        ptr_fhandle = *(fdb_file_handle ***)&pfStack_1d98->seqtree_opt;
        pfVar6 = *ppfVar14;
        pbVar12 = (btree *)pfVar6->op_stats;
        pfStack_1db0 = (fdb_kvs_handle *)0x11b04d;
        iVar5 = bcmp(ptr_fhandle,pbVar12,sVar9);
        if (iVar5 != 0) goto LAB_0011b187;
        ptr_fhandle = (fdb_file_handle **)pfVar17->compactor_sleep_duration;
        pbVar12 = pfVar6->staletree;
        pfStack_1db0 = (fdb_kvs_handle *)0x11b06c;
        iVar5 = bcmp(ptr_fhandle,pbVar12,pfVar17->buffercache_size);
        if (iVar5 != 0) goto LAB_0011b1a2;
        ptr_fhandle = *(fdb_file_handle ***)&pfVar17->multi_kv_instances;
        pbVar12 = (pfVar6->field_6).seqtree;
        pfStack_1db0 = (fdb_kvs_handle *)0x11b08b;
        iVar5 = bcmp(ptr_fhandle,pbVar12,pfVar17->wal_threshold);
        if (iVar5 != 0) goto LAB_0011b197;
        pfStack_1db0 = (fdb_kvs_handle *)0x11b09b;
        fdb_doc_free((fdb_doc *)pfVar17);
        pfStack_1d98 = (fdb_config *)0x0;
        pfStack_1db0 = (fdb_kvs_handle *)0x11b0ae;
        fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_1da0);
        ppfVar14 = ppfVar14 + -1;
        pfVar26 = pfVar17;
        if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
          pfStack_1db0 = (fdb_kvs_handle *)0x11b0c5;
          fdb_iterator_close((fdb_iterator *)pfStack_1da0);
          pfStack_1db0 = (fdb_kvs_handle *)0x11b0cf;
          fdb_kvs_close(pfStack_1d90);
          pfStack_1db0 = (fdb_kvs_handle *)0x11b0d9;
          fdb_close(pfStack_1d88);
          lVar22 = 0;
          do {
            pfStack_1db0 = (fdb_kvs_handle *)0x11b0e5;
            fdb_doc_free(apfStack_1d68[lVar22]);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 10);
          pfStack_1db0 = (fdb_kvs_handle *)0x11b0f3;
          fdb_shutdown();
          pfStack_1db0 = (fdb_kvs_handle *)0x11b0f8;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (sequence_iterator_seek_test(bool)::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_1db0 = (fdb_kvs_handle *)0x11b129;
          fprintf(_stderr,pcVar21,"sequence iterator seek test");
          return;
        }
      }
LAB_0011b192:
      pfVar17 = pfVar26;
      pfStack_1db0 = (fdb_kvs_handle *)0x11b197;
      sequence_iterator_seek_test();
LAB_0011b197:
      pfStack_1db0 = (fdb_kvs_handle *)0x11b1a2;
      sequence_iterator_seek_test();
LAB_0011b1a2:
      ptr_iterator_00 = &pfStack_1d98;
      pfStack_1db0 = (fdb_kvs_handle *)0x11b1ad;
      sequence_iterator_seek_test();
      goto LAB_0011b1ad;
    }
  }
  else {
LAB_0011b1ad:
    pfStack_1db0 = (fdb_kvs_handle *)0x11b1b2;
    sequence_iterator_seek_test();
LAB_0011b1b2:
    pfStack_1db0 = (fdb_kvs_handle *)0x11b1b7;
    sequence_iterator_seek_test();
LAB_0011b1b7:
    pfStack_1db0 = (fdb_kvs_handle *)0x11b1bc;
    sequence_iterator_seek_test();
  }
  pfStack_1db0 = (fdb_kvs_handle *)iterator_concurrent_compaction;
  sequence_iterator_seek_test();
  ppfStack_2158 = (fdb_doc **)0x11b1de;
  ppfStack_1dd8 = ptr_iterator_00;
  pbStack_1dd0 = pbVar12;
  ppfStack_1dc8 = ppfVar14;
  pfStack_1dc0 = pfVar17;
  ppfStack_1db8 = ptr_fhandle;
  pfStack_1db0 = pfVar6;
  gettimeofday((timeval *)(auStack_2110 + 0x28),(__timezone_ptr_t)0x0);
  ppfStack_2158 = (fdb_doc **)0x11b1e3;
  memleak_start();
  pfStack_2148 = (fdb_kvs_handle *)0x0;
  ppfStack_2158 = (fdb_doc **)0x11b1f9;
  fdb_get_default_config();
  ppfStack_2158 = (fdb_doc **)0x11b206;
  fdb_get_default_kvs_config();
  fStack_20d8.wal_threshold = 0x400;
  fStack_20d8.seqtree_opt = '\x01';
  fStack_20d8.flags = 1;
  ppfStack_2158 = (fdb_doc **)0x11b225;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_2158 = (fdb_doc **)0x11b23c;
  fdb_open(&pfStack_2128,"./iterator_test1",&fStack_20d8);
  ppfStack_2158 = (fdb_doc **)0x11b253;
  fdb_kvs_open(pfStack_2128,&pfStack_2130,"db",(fdb_kvs_config *)(auStack_2110 + 0x10));
  pcVar21 = "body%d";
  pfVar6 = (fdb_kvs_handle *)(apfStack_1fe0 + 0x20);
  doc_00 = (fdb_doc **)0x0;
  do {
    ppfStack_2158 = (fdb_doc **)0x11b27f;
    sprintf((char *)apfStack_1fe0,"key%d",doc_00);
    ppfStack_2158 = (fdb_doc **)0x11b28e;
    sprintf((char *)pfVar6,"body%d",doc_00);
    pfVar13 = pfStack_2130;
    ppfStack_2158 = (fdb_doc **)0x11b29b;
    sVar7 = strlen((char *)apfStack_1fe0);
    ppfStack_2158 = (fdb_doc **)0x11b2a6;
    sVar8 = strlen((char *)pfVar6);
    ppfStack_2158 = (fdb_doc **)0x11b2ba;
    fdb_set_kv(pfVar13,apfStack_1fe0,sVar7,pfVar6,sVar8);
    uVar18 = (int)doc_00 + 1;
    doc_00 = (fdb_doc **)(ulong)uVar18;
  } while (uVar18 != 10);
  ppfStack_2158 = (fdb_doc **)0x11b2cd;
  fdb_commit(pfStack_2128,'\0');
  ppfStack_2158 = (fdb_doc **)0x11b2e6;
  fdb_open(&pfStack_2118,"./iterator_test1",&fStack_20d8);
  ppfVar14 = (fdb_kvs_handle **)(auStack_2110 + 8);
  ppfStack_2158 = (fdb_doc **)0x11b302;
  fdb_kvs_open(pfStack_2118,ppfVar14,"db",(fdb_kvs_config *)(auStack_2110 + 0x10));
  ppfStack_2158 = (fdb_doc **)0x11b313;
  fdb_compact(pfStack_2128,"./iterator_test2");
  ppfStack_2158 = (fdb_doc **)0x11b331;
  fVar4 = fdb_iterator_init((fdb_kvs_handle *)auStack_2110._8_8_,&pfStack_2138,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_2158 = (fdb_doc **)0x11b34f;
    fVar4 = fdb_iterator_sequence_init(pfStack_2130,&pfStack_2140,0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b4bb;
    pcVar21 = (char *)&pfStack_2120;
    pfVar6 = (fdb_kvs_handle *)auStack_2110;
    doc_00 = (fdb_doc **)0x0;
    do {
      ppfStack_2158 = (fdb_doc **)0x11b381;
      sprintf((char *)apfStack_1fe0,"key%d",doc_00);
      pfVar13 = pfStack_2130;
      ppfStack_2158 = (fdb_doc **)0x11b38e;
      sVar7 = strlen((char *)apfStack_1fe0);
      ppfStack_2158 = (fdb_doc **)0x11b3a2;
      fdb_get_kv(pfVar13,apfStack_1fe0,sVar7,(void **)pcVar21,(size_t *)pfVar6);
      ppfStack_2158 = (fdb_doc **)0x11b3ac;
      fdb_free_block(pfStack_2120);
      uVar18 = (int)doc_00 + 1;
      doc_00 = (fdb_doc **)(ulong)uVar18;
    } while (uVar18 != 10);
    ppfVar14 = &pfStack_2148;
    do {
      pfStack_2148 = (fdb_kvs_handle *)0x0;
      ppfStack_2158 = (fdb_doc **)0x11b3ce;
      fVar4 = fdb_iterator_get(pfStack_2138,(fdb_doc **)ppfVar14);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        ppfStack_2158 = (fdb_doc **)0x11b4b1;
        iterator_concurrent_compaction();
        goto LAB_0011b4b1;
      }
      ppfStack_2158 = (fdb_doc **)0x11b3e0;
      fdb_doc_free((fdb_doc *)pfStack_2148);
      ppfStack_2158 = (fdb_doc **)0x11b3ea;
      fVar4 = fdb_iterator_next(pfStack_2138);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_2158 = (fdb_doc **)0x11b3f9;
    fVar4 = fdb_iterator_close(pfStack_2138);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b4c0;
    ppfVar14 = &pfStack_2148;
    do {
      pfStack_2148 = (fdb_kvs_handle *)0x0;
      ppfStack_2158 = (fdb_doc **)0x11b41c;
      fVar4 = fdb_iterator_get(pfStack_2140,(fdb_doc **)ppfVar14);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b4b1;
      ppfStack_2158 = (fdb_doc **)0x11b42e;
      fdb_doc_free((fdb_doc *)pfStack_2148);
      ppfStack_2158 = (fdb_doc **)0x11b438;
      fVar4 = fdb_iterator_next(pfStack_2140);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_2158 = (fdb_doc **)0x11b447;
    fVar4 = fdb_iterator_close(pfStack_2140);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      ppfStack_2158 = (fdb_doc **)0x11b455;
      fdb_close(pfStack_2128);
      ppfStack_2158 = (fdb_doc **)0x11b45f;
      fdb_close(pfStack_2118);
      ppfStack_2158 = (fdb_doc **)0x11b464;
      fdb_shutdown();
      ppfStack_2158 = (fdb_doc **)0x11b469;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_concurrent_compaction()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      ppfStack_2158 = (fdb_doc **)0x11b49a;
      fprintf(_stderr,pcVar21,"iterator with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011b4b6:
    ppfStack_2158 = (fdb_doc **)0x11b4bb;
    iterator_concurrent_compaction();
LAB_0011b4bb:
    ppfStack_2158 = (fdb_doc **)0x11b4c0;
    iterator_concurrent_compaction();
LAB_0011b4c0:
    ppfStack_2158 = (fdb_doc **)0x11b4c5;
    iterator_concurrent_compaction();
  }
  doc_02 = (char *)apfStack_1fe0;
  ppfStack_2158 = (fdb_doc **)iterator_offset_access_test;
  iterator_concurrent_compaction();
  ppfStack_4430 = (fdb_doc **)0x11b4e7;
  ppfStack_2180 = ppfVar14;
  pfStack_2178 = pfVar6;
  ppfStack_2168 = (fdb_doc **)doc_02;
  ppfStack_2160 = (fdb_doc **)pcVar21;
  ppfStack_2158 = doc_00;
  gettimeofday(&tStack_43d8,(__timezone_ptr_t)0x0);
  ppfStack_4430 = (fdb_doc **)0x11b4ec;
  memleak_start();
  pfStack_4400 = (fdb_doc *)0x0;
  ppfStack_4430 = (fdb_doc **)0x11b501;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar13 = (fdb_kvs_handle *)(auStack_42c8 + 0x108);
  ppfStack_4430 = (fdb_doc **)0x11b511;
  fdb_get_default_config();
  ppfStack_4430 = (fdb_doc **)0x11b51b;
  fdb_get_default_kvs_config();
  auStack_41b8[8] = '\0';
  auStack_41b8[9] = '\x02';
  auStack_41b8[10] = '\0';
  auStack_41b8[0xb] = '\0';
  auStack_41b8[0xc] = '\0';
  auStack_41b8[0xd] = '\0';
  auStack_41b8[0xe] = '\0';
  auStack_41b8[0xf] = '\0';
  auStack_41b8[0] = '\0';
  auStack_41b8[1] = '\x10';
  auStack_41b8[2] = '\0';
  auStack_41b8[3] = '\0';
  auStack_41b8[4] = '\0';
  auStack_41b8[5] = '\0';
  auStack_41b8[6] = '\0';
  auStack_41b8[7] = '\0';
  uStack_419c = 1;
  uStack_4192 = 0;
  uStack_41a4 = 1;
  ppfStack_4430 = (fdb_doc **)0x11b54e;
  fVar4 = fdb_open(&pfStack_4410,"./iterator_test1",(fdb_config *)pfVar13);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_4430 = (fdb_doc **)0x11b571;
    fVar4 = fdb_kvs_open(pfStack_4410,&pfStack_4418,"DB",&fStack_43f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ba02;
    ppfStack_4430 = (fdb_doc **)0x11b594;
    fVar4 = fdb_kvs_open(pfStack_4410,&pfStack_43f8,"ODB",&fStack_43f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ba07;
    doc_02 = (char *)apfStack_43c8;
    pfVar6 = (fdb_kvs_handle *)auStack_42c8;
    pcVar21 = (char *)0x0;
    uVar27 = 0;
    do {
      ppfStack_4430 = (fdb_doc **)0x11b5c3;
      sprintf(doc_02,"key%d",uVar27 & 0xffffffff);
      ppfStack_4430 = (fdb_doc **)0x11b5d7;
      sprintf((char *)pfVar6,"body%d",uVar27 & 0xffffffff);
      doc_00 = (fdb_doc **)((long)apfStack_40c8 + (long)pcVar21);
      ppfStack_4430 = (fdb_doc **)0x11b5ea;
      pfVar13 = (fdb_kvs_handle *)strlen(doc_02);
      ppfStack_4430 = (fdb_doc **)0x11b5f5;
      sVar7 = strlen((char *)pfVar6);
      ppfStack_4430 = (fdb_doc **)0x11b60f;
      fdb_doc_create(doc_00,doc_02,(size_t)pfVar13,(void *)0x0,0,pfVar6,sVar7);
      ppfStack_4430 = (fdb_doc **)0x11b621;
      fVar4 = fdb_set(pfStack_4418,apfStack_40c8[uVar27]);
      pfVar3 = pfStack_43f8;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011b9d0:
        ppfStack_4430 = (fdb_doc **)0x11b9d5;
        iterator_offset_access_test();
        goto LAB_0011b9d5;
      }
      ppfStack_4430 = (fdb_doc **)0x11b636;
      sVar7 = strlen(doc_02);
      ppfStack_4430 = (fdb_doc **)0x11b656;
      fVar4 = fdb_set_kv(pfVar3,doc_02,sVar7,&apfStack_40c8[uVar27]->offset,8);
      pfVar13 = pfVar3;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        ppfStack_4430 = (fdb_doc **)0x11b9d0;
        iterator_offset_access_test();
        goto LAB_0011b9d0;
      }
      uVar27 = uVar27 + 1;
      pcVar21 = (char *)((long)pcVar21 + 8);
    } while (uVar27 != 1000);
    ppfStack_4430 = (fdb_doc **)0x11b681;
    fVar4 = fdb_commit(pfStack_4410,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ba0c;
    pfVar13 = (fdb_kvs_handle *)0xfa;
    doc_02 = "key%d";
    pcVar21 = (char *)apfStack_43c8;
    do {
      ppfStack_4430 = (fdb_doc **)0x11b6a9;
      sprintf(pcVar21,"key%d",pfVar13);
      pfVar6 = pfStack_4418;
      ppfStack_4430 = (fdb_doc **)0x11b6b6;
      sVar7 = strlen(pcVar21);
      ppfStack_4430 = (fdb_doc **)0x11b6c4;
      fVar4 = fdb_del_kv(pfVar6,pcVar21,sVar7);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9d5;
      uVar18 = (int)pfVar13 + 1;
      pfVar13 = (fdb_kvs_handle *)(ulong)uVar18;
    } while (uVar18 != 500);
    doc_02 = (char *)apfStack_43c8;
    pfVar6 = (fdb_kvs_handle *)auStack_42c8;
    pcVar21 = (char *)0x0;
    uVar27 = 0;
    do {
      ppfStack_4430 = (fdb_doc **)0x11b6fd;
      sprintf(doc_02,"k0y%d",uVar27 & 0xffffffff);
      ppfStack_4430 = (fdb_doc **)0x11b711;
      sprintf((char *)pfVar6,"b0dy%d",uVar27 & 0xffffffff);
      doc_00 = (fdb_doc **)((long)apfStack_40c8 + (long)pcVar21);
      ppfStack_4430 = (fdb_doc **)0x11b729;
      fdb_doc_free(apfStack_40c8[uVar27]);
      ppfStack_4430 = (fdb_doc **)0x11b731;
      pfVar13 = (fdb_kvs_handle *)strlen(doc_02);
      ppfStack_4430 = (fdb_doc **)0x11b73c;
      sVar7 = strlen((char *)pfVar6);
      ppfStack_4430 = (fdb_doc **)0x11b756;
      fdb_doc_create(doc_00,doc_02,(size_t)pfVar13,(void *)0x0,0,pfVar6,sVar7);
      ppfStack_4430 = (fdb_doc **)0x11b768;
      fVar4 = fdb_set(pfStack_4418,apfStack_40c8[uVar27]);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9da;
      uVar27 = uVar27 + 1;
      pcVar21 = (char *)((long)pcVar21 + 8);
    } while (uVar27 != 0xfa);
    ppfStack_4430 = (fdb_doc **)0x11b790;
    fVar4 = fdb_commit(pfStack_4410,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ba11;
    ppfStack_4430 = (fdb_doc **)0x11b7b8;
    fdb_iterator_init(pfStack_43f8,&pfStack_4408,(void *)0x0,0,(void *)0x0,0,2);
    pcVar21 = (char *)0x1ea;
    pfVar13 = afStack_3128;
    doc_02 = (char *)&pfStack_4400;
    do {
      ppfStack_4430 = (fdb_doc **)0x11b7d8;
      fVar4 = fdb_get_byoffset(pfStack_4418,*(fdb_doc **)&pfVar13->kvs_config);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9e4;
      ppfStack_4430 = (fdb_doc **)0x11b7f6;
      fVar4 = fdb_iterator_seek(pfStack_4408,(void *)(*(size_t **)&pfVar13->kvs_config)[4],
                                **(size_t **)&pfVar13->kvs_config,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9df;
      ppfStack_4430 = (fdb_doc **)0x11b80b;
      fVar4 = fdb_iterator_get(pfStack_4408,(fdb_doc **)doc_02);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9ee;
      if (*pfStack_4400->body != *(long *)(*(long *)&pfVar13->kvs_config + 0x30)) {
        ppfStack_4430 = (fdb_doc **)0x11b86c;
        iterator_offset_access_test();
      }
      ppfStack_4430 = (fdb_doc **)0x11b835;
      fVar4 = fdb_del(pfStack_4418,*(fdb_doc **)&pfVar13->kvs_config);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9e9;
      ppfStack_4430 = (fdb_doc **)0x11b84a;
      fdb_get_metaonly(pfStack_4418,*(fdb_doc **)&pfVar13->kvs_config);
      pcVar21 = (char *)((long)pcVar21 + 10);
      pfVar13 = (fdb_kvs_handle *)&pfVar13->dhandle;
    } while (pcVar21 < (fdb_doc **)0x3de);
    ppfStack_4430 = (fdb_doc **)0x11b878;
    fdb_iterator_close(pfStack_4408);
    ppfStack_4430 = (fdb_doc **)0x11b887;
    fVar4 = fdb_commit(pfStack_4410,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) {
      doc_02 = (char *)apfStack_43c8;
      pcVar21 = "b1dy%d";
      pfVar6 = (fdb_kvs_handle *)auStack_42c8;
      doc_00 = (fdb_doc **)0x0;
      do {
        ppfStack_4430 = (fdb_doc **)0x11b8b8;
        sprintf(doc_02,"k1y%d",doc_00);
        ppfStack_4430 = (fdb_doc **)0x11b8c7;
        sprintf((char *)pfVar6,"b1dy%d",doc_00);
        pfVar3 = pfStack_4418;
        ppfStack_4430 = (fdb_doc **)0x11b8d4;
        pfVar13 = (fdb_kvs_handle *)strlen(doc_02);
        ppfStack_4430 = (fdb_doc **)0x11b8df;
        sVar7 = strlen((char *)pfVar6);
        ppfStack_4430 = (fdb_doc **)0x11b8f3;
        fVar4 = fdb_set_kv(pfVar3,doc_02,(size_t)pfVar13,pfVar6,sVar7);
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9f3;
        uVar18 = (int)doc_00 + 1;
        doc_00 = (fdb_doc **)(ulong)uVar18;
      } while (uVar18 != 0xfa);
      doc_02 = (char *)0x1ea;
      pfVar13 = afStack_3128;
      while( true ) {
        ppfStack_4430 = (fdb_doc **)0x11b920;
        fVar4 = fdb_get_byoffset(pfStack_4418,*(fdb_doc **)&pfVar13->kvs_config);
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) break;
        if (*(char *)(*(long *)&pfVar13->kvs_config + 0x48) == '\0') {
          ppfStack_4430 = (fdb_doc **)0x11b94d;
          iterator_offset_access_test();
        }
        doc_02 = (char *)((long)doc_02 + 10);
        pfVar13 = (fdb_kvs_handle *)&pfVar13->dhandle;
        if ((fdb_doc **)0x3dd < doc_02) {
          lVar22 = 0;
          do {
            ppfStack_4430 = (fdb_doc **)0x11b95e;
            fdb_doc_free(apfStack_40c8[lVar22]);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 1000);
          ppfStack_4430 = (fdb_doc **)0x11b974;
          fdb_doc_free(pfStack_4400);
          ppfStack_4430 = (fdb_doc **)0x11b97e;
          fdb_close(pfStack_4410);
          ppfStack_4430 = (fdb_doc **)0x11b983;
          fdb_shutdown();
          ppfStack_4430 = (fdb_doc **)0x11b988;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (iterator_offset_access_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          ppfStack_4430 = (fdb_doc **)0x11b9b9;
          fprintf(_stderr,pcVar21,"iterator offset access test");
          return;
        }
      }
LAB_0011b9f8:
      ppfStack_4430 = (fdb_doc **)0x11b9fd;
      iterator_offset_access_test();
      goto LAB_0011b9fd;
    }
  }
  else {
LAB_0011b9fd:
    ppfStack_4430 = (fdb_doc **)0x11ba02;
    iterator_offset_access_test();
LAB_0011ba02:
    ppfStack_4430 = (fdb_doc **)0x11ba07;
    iterator_offset_access_test();
LAB_0011ba07:
    ppfStack_4430 = (fdb_doc **)0x11ba0c;
    iterator_offset_access_test();
LAB_0011ba0c:
    ppfStack_4430 = (fdb_doc **)0x11ba11;
    iterator_offset_access_test();
LAB_0011ba11:
    ppfStack_4430 = (fdb_doc **)0x11ba16;
    iterator_offset_access_test();
  }
  ppfStack_4430 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_48b8 = (fdb_iterator **)0x11ba36;
  pfStack_4450 = pfVar13;
  pfStack_4448 = pfVar6;
  ppfStack_4440 = (fdb_doc **)doc_02;
  ppfStack_4438 = (fdb_doc **)pcVar21;
  ppfStack_4430 = doc_00;
  gettimeofday(&tStack_4880,(__timezone_ptr_t)0x0);
  ppfStack_48b8 = (fdb_iterator **)0x11ba3b;
  memleak_start();
  ppfStack_48b8 = (fdb_iterator **)0x11ba4b;
  fdb_get_default_config();
  fStack_4648.buffercache_size = 0;
  ppfStack_48b8 = (fdb_iterator **)0x11ba63;
  fdb_get_default_kvs_config();
  ppfStack_48b8 = (fdb_iterator **)0x11ba86;
  sprintf(acStack_4750,"rm -rf  %s*","./dummy");
  ppfStack_48b8 = (fdb_iterator **)0x11ba8e;
  system(acStack_4750);
  ppfStack_48b8 = (fdb_iterator **)0x11baa1;
  fdb_open(&pfStack_4888,"./dummy",&fStack_4648);
  ppfStack_48b8 = (fdb_iterator **)0x11bab4;
  fdb_kvs_open(pfStack_4888,&pfStack_4890,(char *)0x0,&fStack_4768);
  uVar27 = 0;
  do {
    ppfStack_48b8 = (fdb_iterator **)0x11bae0;
    sprintf((char *)apfStack_4870,"k%06d\n",uVar27);
    ppfStack_48b8 = (fdb_iterator **)0x11baef;
    sprintf(acStack_4550,"v%06d\n",uVar27);
    ppfStack_48b8 = (fdb_iterator **)0x11bb0a;
    fdb_set_kv(pfStack_4890,apfStack_4870,8,acStack_4550,8);
    uVar18 = (int)uVar27 + 1;
    uVar27 = (ulong)uVar18;
  } while (uVar18 != 3);
  ppfStack_48b8 = (fdb_iterator **)0x11bb2c;
  sprintf((char *)apfStack_4870,"k%06d\n",1);
  ppfStack_48b8 = (fdb_iterator **)0x11bb3e;
  fdb_del_kv(pfStack_4890,apfStack_4870,8);
  ppfStack_48b8 = (fdb_iterator **)0x11bb4a;
  fdb_commit(pfStack_4888,'\0');
  apfStack_4870[0]._0_2_ = 0x61;
  acStack_4750[0] = 'z';
  acStack_4750[1] = '\0';
  ppfStack_48b8 = (fdb_iterator **)0x11bb81;
  fVar4 = fdb_iterator_init(pfStack_4890,&pfStack_48a0,apfStack_4870,1,acStack_4750,1,2);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_48b8 = (fdb_iterator **)0x11bb93;
    fVar4 = fdb_iterator_seek_to_max(pfStack_48a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdbc;
    pfStack_4898 = (fdb_doc *)0x0;
    ppfStack_48b8 = (fdb_iterator **)0x11bbb1;
    fVar4 = fdb_iterator_get(pfStack_48a0,&pfStack_4898);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdc1;
    ppfStack_48b8 = (fdb_iterator **)0x11bbd4;
    sprintf((char *)apfStack_4870,"k%06d\n",2);
    if (*pfStack_4898->key != CONCAT62(apfStack_4870[0]._2_6_,apfStack_4870[0]._0_2_))
    goto LAB_0011bdc6;
    ppfStack_48b8 = (fdb_iterator **)0x11bbee;
    fdb_doc_free(pfStack_4898);
    ppfStack_48b8 = (fdb_iterator **)0x11bbf8;
    fVar4 = fdb_iterator_prev(pfStack_48a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdd0;
    pfStack_4898 = (fdb_doc *)0x0;
    ppfStack_48b8 = (fdb_iterator **)0x11bc16;
    fVar4 = fdb_iterator_get(pfStack_48a0,&pfStack_4898);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdd5;
    ppfStack_48b8 = (fdb_iterator **)0x11bc36;
    sprintf((char *)apfStack_4870,"k%06d\n",0);
    if (*pfStack_4898->key != CONCAT62(apfStack_4870[0]._2_6_,apfStack_4870[0]._0_2_))
    goto LAB_0011bdda;
    ppfStack_48b8 = (fdb_iterator **)0x11bc50;
    fdb_doc_free(pfStack_4898);
    ppfVar11 = &pfStack_48a0;
    ppfStack_48b8 = (fdb_iterator **)0x11bc5d;
    fdb_iterator_close(pfStack_48a0);
    ppfStack_48b8 = (fdb_iterator **)0x11bc89;
    fVar4 = fdb_iterator_init(pfStack_4890,ppfVar11,apfStack_4870,1,acStack_4750,1,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bde4;
    ppfStack_48b8 = (fdb_iterator **)0x11bc9b;
    fVar4 = fdb_iterator_seek_to_min(pfStack_48a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bde9;
    pfStack_4898 = (fdb_doc *)0x0;
    ppfStack_48b8 = (fdb_iterator **)0x11bcb9;
    fVar4 = fdb_iterator_get(pfStack_48a0,&pfStack_4898);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdee;
    ppfVar11 = apfStack_4870;
    ppfStack_48b8 = (fdb_iterator **)0x11bcd9;
    sprintf((char *)ppfVar11,"k%06d\n",0);
    if (*pfStack_4898->key != CONCAT62(apfStack_4870[0]._2_6_,apfStack_4870[0]._0_2_))
    goto LAB_0011bdf3;
    ppfStack_48b8 = (fdb_iterator **)0x11bcf3;
    fdb_doc_free(pfStack_4898);
    ppfStack_48b8 = (fdb_iterator **)0x11bcfd;
    fVar4 = fdb_iterator_next(pfStack_48a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdfd;
    pfStack_4898 = (fdb_doc *)0x0;
    ppfStack_48b8 = (fdb_iterator **)0x11bd1b;
    fVar4 = fdb_iterator_get(pfStack_48a0,&pfStack_4898);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011be02;
    ppfVar11 = apfStack_4870;
    ppfStack_48b8 = (fdb_iterator **)0x11bd3e;
    sprintf((char *)ppfVar11,"k%06d\n",2);
    if (*pfStack_4898->key == CONCAT62(apfStack_4870[0]._2_6_,apfStack_4870[0]._0_2_)) {
      ppfStack_48b8 = (fdb_iterator **)0x11bd58;
      fdb_doc_free(pfStack_4898);
      ppfStack_48b8 = (fdb_iterator **)0x11bd62;
      fdb_iterator_close(pfStack_48a0);
      ppfStack_48b8 = (fdb_iterator **)0x11bd6c;
      fdb_close(pfStack_4888);
      ppfStack_48b8 = (fdb_iterator **)0x11bd71;
      fdb_shutdown();
      ppfStack_48b8 = (fdb_iterator **)0x11bd76;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      ppfStack_48b8 = (fdb_iterator **)0x11bda7;
      fprintf(_stderr,pcVar21,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_48b8 = (fdb_iterator **)0x11bdbc;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdbc:
    ppfStack_48b8 = (fdb_iterator **)0x11bdc1;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc1:
    ppfStack_48b8 = (fdb_iterator **)0x11bdc6;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc6:
    ppfStack_48b8 = (fdb_iterator **)0x11bdd0;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd0:
    ppfStack_48b8 = (fdb_iterator **)0x11bdd5;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd5:
    ppfStack_48b8 = (fdb_iterator **)0x11bdda;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdda:
    ppfVar11 = apfStack_4870;
    ppfStack_48b8 = (fdb_iterator **)0x11bde4;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde4:
    ppfStack_48b8 = (fdb_iterator **)0x11bde9;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde9:
    ppfStack_48b8 = (fdb_iterator **)0x11bdee;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdee:
    ppfStack_48b8 = (fdb_iterator **)0x11bdf3;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdf3:
    ppfStack_48b8 = (fdb_iterator **)0x11bdfd;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdfd:
    ppfStack_48b8 = (fdb_iterator **)0x11be02;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011be02:
    ppfStack_48b8 = (fdb_iterator **)0x11be07;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_48b8 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_4a10 = (code *)0x11be25;
  ppfStack_48b8 = ppfVar11;
  gettimeofday(&tStack_49c0,(__timezone_ptr_t)0x0);
  pfStack_49f8 = (fdb_doc *)0x0;
  pcStack_4a10 = (code *)0x11be33;
  memleak_start();
  pfVar17 = &fStack_49b0;
  pcStack_4a10 = (code *)0x11be40;
  fdb_get_default_config();
  pcStack_4a10 = (code *)0x11be4a;
  fdb_get_default_kvs_config();
  pcStack_4a10 = (code *)0x11be56;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_4a10 = (code *)0x11be6a;
  fVar4 = fdb_open(&pfStack_49e0,"./iterator_test1",pfVar17);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pcStack_4a10 = (code *)0x11be86;
    fVar4 = fdb_kvs_open_default(pfStack_49e0,&pfStack_49e8,&fStack_49d8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c091;
    pcStack_4a10 = (code *)0x11bea9;
    fdb_set_kv(pfStack_49e8,"a",1,(void *)0x0,0);
    pfVar17 = (fdb_config *)0x155b95;
    pcStack_4a10 = (code *)0x11bec7;
    fdb_set_kv(pfStack_49e8,"b",1,(void *)0x0,0);
    pcStack_4a10 = (code *)0x11bee2;
    fdb_set_kv(pfStack_49e8,"c",1,(void *)0x0,0);
    pcStack_4a10 = (code *)0x11bf06;
    fVar4 = fdb_iterator_init(pfStack_49e8,&pfStack_49f0,"b",1,(void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c098;
    pcStack_4a10 = (code *)0x11bf18;
    fVar4 = fdb_iterator_seek_to_min(pfStack_49f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c09d;
    pcStack_4a10 = (code *)0x11bf2f;
    fVar4 = fdb_iterator_get(pfStack_49f0,&pfStack_49f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0a4;
    if (*pfStack_49f8->key != 'b') goto LAB_0011c0ab;
    pcStack_4a10 = (code *)0x11bf4e;
    fdb_doc_free(pfStack_49f8);
    pfStack_49f8 = (fdb_doc *)0x0;
    pcStack_4a10 = (code *)0x11bf61;
    fVar4 = fdb_iterator_seek_to_max(pfStack_49f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0b3;
    pcStack_4a10 = (code *)0x11bf78;
    fVar4 = fdb_iterator_get(pfStack_49f0,&pfStack_49f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0ba;
    if (*pfStack_49f8->key != 'c') goto LAB_0011c0c1;
    pcStack_4a10 = (code *)0x11bf97;
    fdb_doc_free(pfStack_49f8);
    pfStack_49f8 = (fdb_doc *)0x0;
    pcStack_4a10 = (code *)0x11bfaa;
    fVar4 = fdb_iterator_prev(pfStack_49f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0c9;
    pcStack_4a10 = (code *)0x11bfc1;
    fVar4 = fdb_iterator_get(pfStack_49f0,&pfStack_49f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0d0;
    if (*pfStack_49f8->key != 'b') goto LAB_0011c0d7;
    pcStack_4a10 = (code *)0x11bfe0;
    fdb_doc_free(pfStack_49f8);
    pfStack_49f8 = (fdb_doc *)0x0;
    pcStack_4a10 = (code *)0x11bff3;
    fVar4 = fdb_iterator_next(pfStack_49f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    pcStack_4a10 = (code *)0x11c00a;
    fVar4 = fdb_iterator_get(pfStack_49f0,&pfStack_49f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0e6;
    if (*pfStack_49f8->key == 'c') {
      pcStack_4a10 = (code *)0x11c029;
      fdb_doc_free(pfStack_49f8);
      pfStack_49f8 = (fdb_doc *)0x0;
      pcStack_4a10 = (code *)0x11c03c;
      fdb_iterator_close(pfStack_49f0);
      pcStack_4a10 = (code *)0x11c046;
      fdb_close(pfStack_49e0);
      pcStack_4a10 = (code *)0x11c04b;
      fdb_shutdown();
      pcStack_4a10 = (code *)0x11c050;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_4a10 = (code *)0x11c081;
      fprintf(_stderr,pcVar21,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_4a10 = (code *)0x11c091;
    iterator_uncommited_seeks();
LAB_0011c091:
    pcStack_4a10 = (code *)0x11c098;
    iterator_uncommited_seeks();
LAB_0011c098:
    pcStack_4a10 = (code *)0x11c09d;
    iterator_uncommited_seeks();
LAB_0011c09d:
    pcStack_4a10 = (code *)0x11c0a4;
    iterator_uncommited_seeks();
LAB_0011c0a4:
    pcStack_4a10 = (code *)0x11c0ab;
    iterator_uncommited_seeks();
LAB_0011c0ab:
    pcStack_4a10 = (code *)0x11c0b3;
    iterator_uncommited_seeks();
LAB_0011c0b3:
    pcStack_4a10 = (code *)0x11c0ba;
    iterator_uncommited_seeks();
LAB_0011c0ba:
    pcStack_4a10 = (code *)0x11c0c1;
    iterator_uncommited_seeks();
LAB_0011c0c1:
    pcStack_4a10 = (code *)0x11c0c9;
    iterator_uncommited_seeks();
LAB_0011c0c9:
    pcStack_4a10 = (code *)0x11c0d0;
    iterator_uncommited_seeks();
LAB_0011c0d0:
    pcStack_4a10 = (code *)0x11c0d7;
    iterator_uncommited_seeks();
LAB_0011c0d7:
    pcStack_4a10 = (code *)0x11c0df;
    iterator_uncommited_seeks();
LAB_0011c0df:
    pcStack_4a10 = (code *)0x11c0e6;
    iterator_uncommited_seeks();
LAB_0011c0e6:
    pcStack_4a10 = (code *)0x11c0ed;
    iterator_uncommited_seeks();
  }
  pcStack_4a10 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_4db8 = (fdb_config *)0x11c10f;
  pfStack_4a20 = pfVar17;
  pcStack_4a18 = (char *)apfStack_4870;
  pcStack_4a10 = (code *)uVar27;
  gettimeofday(&tStack_4d30,(__timezone_ptr_t)0x0);
  pfStack_4db8 = (fdb_config *)0x11c114;
  memleak_start();
  pfVar17 = &fStack_4c18;
  pfStack_4db8 = (fdb_config *)0x11c124;
  fdb_get_default_config();
  fStack_4c18.buffercache_size = 0;
  pfStack_4db8 = (fdb_config *)0x11c136;
  fdb_get_default_kvs_config();
  pfStack_4db8 = (fdb_config *)0x11c156;
  sprintf(acStack_4b20,"rm -rf  %s*","./iterator_test");
  pfStack_4db8 = (fdb_config *)0x11c15e;
  system(acStack_4b20);
  pfStack_4db8 = (fdb_config *)0x11c172;
  fVar4 = fdb_open(&pfStack_4d90,"./iterator_test1",pfVar17);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_4db8 = (fdb_config *)0x11c190;
    fVar4 = fdb_kvs_open(pfStack_4d90,&pfStack_4d98,(char *)0x0,&fStack_4d48);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c32a;
    uStack_4d58 = 0x34323634353773;
    uStack_4d51 = 0xff;
    uStack_4d70 = 0x34323634353773;
    uStack_4d69 = 0x10000ff;
    uStack_4d60._0_4_ = 0x34353773;
    uStack_4d60._4_1_ = true;
    uStack_4d60._5_1_ = true;
    uStack_4d60._6_1_ = '4';
    uStack_4d60._7_1_ = 0xff;
    uStack_4d80 = 0xff34323634353773;
    uStack_4d78 = 0xff;
    uStack_4d20 = 0x3179656b;
    uStack_4d1c = 0;
    pfStack_4db8 = (fdb_config *)0x11c1f4;
    fVar4 = fdb_set_kv(pfStack_4d98,&uStack_4d58,0xb,&uStack_4d20,4);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c32f;
    uStack_4d1c = 0;
    uStack_4d20 = 0x3279656b;
    pfStack_4db8 = (fdb_config *)0x11c228;
    fVar4 = fdb_set_kv(pfStack_4d98,&uStack_4d70,0xb,&uStack_4d20,4);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c334;
    pfStack_4db8 = (fdb_config *)0x11c23f;
    fVar4 = fdb_commit(pfStack_4d90,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c339;
    pfStack_4db8 = (fdb_config *)0x11c272;
    fVar4 = fdb_iterator_init(pfStack_4d98,&pfStack_4da0,&uStack_4d60,8,&uStack_4d80,9,10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c33e;
    iVar5 = 0;
    pfVar17 = (fdb_config *)&pfStack_4d88;
    do {
      pfStack_4d88 = (fdb_doc *)0x0;
      pfStack_4db8 = (fdb_config *)0x11c297;
      fVar4 = fdb_iterator_get(pfStack_4da0,(fdb_doc **)pfVar17);
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      iVar5 = iVar5 + 1;
      pfStack_4db8 = (fdb_config *)0x11c2a7;
      fdb_doc_free(pfStack_4d88);
      pfStack_4db8 = (fdb_config *)0x11c2b1;
      fVar4 = fdb_iterator_next(pfStack_4da0);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if (iVar5 != 2) goto LAB_0011c343;
    pfStack_4db8 = (fdb_config *)0x11c2c8;
    fVar4 = fdb_iterator_close(pfStack_4da0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c348;
    pfStack_4db8 = (fdb_config *)0x11c2d6;
    fVar4 = fdb_close(pfStack_4d90);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c34d;
    pfStack_4db8 = (fdb_config *)0x11c2df;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4db8 = (fdb_config *)0x11c2e8;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_4db8 = (fdb_config *)0x11c319;
      fprintf(_stderr,pcVar21,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_4db8 = (fdb_config *)0x11c32a;
    iterator_init_using_substring_test();
LAB_0011c32a:
    pfStack_4db8 = (fdb_config *)0x11c32f;
    iterator_init_using_substring_test();
LAB_0011c32f:
    pfStack_4db8 = (fdb_config *)0x11c334;
    iterator_init_using_substring_test();
LAB_0011c334:
    pfStack_4db8 = (fdb_config *)0x11c339;
    iterator_init_using_substring_test();
LAB_0011c339:
    pfStack_4db8 = (fdb_config *)0x11c33e;
    iterator_init_using_substring_test();
LAB_0011c33e:
    pfStack_4db8 = (fdb_config *)0x11c343;
    iterator_init_using_substring_test();
LAB_0011c343:
    pfStack_4db8 = (fdb_config *)0x11c348;
    iterator_init_using_substring_test();
LAB_0011c348:
    pfStack_4db8 = (fdb_config *)0x11c34d;
    iterator_init_using_substring_test();
LAB_0011c34d:
    pfStack_4db8 = (fdb_config *)0x11c352;
    iterator_init_using_substring_test();
  }
  pfStack_4db8 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_4f10 = (fdb_config *)0x11c36d;
  pfStack_4db8 = pfVar17;
  gettimeofday(&tStack_4ec0,(__timezone_ptr_t)0x0);
  pfStack_4f10 = (fdb_config *)0x11c372;
  memleak_start();
  pfStack_4ef8 = (fdb_iterator *)0x0;
  pfStack_4ee8 = (fdb_doc *)0x0;
  pfVar17 = &fStack_4eb0;
  pfStack_4f10 = (fdb_config *)0x11c389;
  fdb_get_default_config();
  pfStack_4f10 = (fdb_config *)0x11c393;
  fdb_get_default_kvs_config();
  pfStack_4f10 = (fdb_config *)0x11c39f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_4f10 = (fdb_config *)0x11c3b3;
  fVar4 = fdb_open(&pfStack_4ee0,"./iterator_test1",pfVar17);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_4f10 = (fdb_config *)0x11c3cf;
    fVar4 = fdb_kvs_open_default(pfStack_4ee0,&pfStack_4ef0,&fStack_4ed8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c58c;
    pfStack_4f10 = (fdb_config *)0x11c3f2;
    fdb_set_kv(pfStack_4ef0,"A",1,(void *)0x0,0);
    pfVar17 = (fdb_config *)0x155dcc;
    pfStack_4f10 = (fdb_config *)0x11c410;
    fdb_set_kv(pfStack_4ef0,"B",1,(void *)0x0,0);
    pfStack_4f10 = (fdb_config *)0x11c43b;
    fVar4 = fdb_iterator_init(pfStack_4ef0,&pfStack_4ef8,"B",1,"Bzz",3,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c593;
    pfStack_4f10 = (fdb_config *)0x11c44d;
    fVar4 = fdb_iterator_seek_to_max(pfStack_4ef8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c598;
    pfStack_4f10 = (fdb_config *)0x11c464;
    fVar4 = fdb_iterator_get(pfStack_4ef8,&pfStack_4ee8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c59f;
    if (*pfStack_4ee8->key != 'B') goto LAB_0011c5a6;
    pfStack_4f10 = (fdb_config *)0x11c483;
    fdb_doc_free(pfStack_4ee8);
    pfStack_4ee8 = (fdb_doc *)0x0;
    pfStack_4f10 = (fdb_config *)0x11c496;
    fVar4 = fdb_iterator_close(pfStack_4ef8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c5ae;
    pfStack_4ef8 = (fdb_iterator *)0x0;
    pfStack_4f10 = (fdb_config *)0x11c4bd;
    fVar4 = fdb_del_kv(pfStack_4ef0,"B",1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c5b5;
    pfStack_4f10 = (fdb_config *)0x11c4f4;
    fVar4 = fdb_iterator_init(pfStack_4ef0,&pfStack_4ef8,"B",1,"Bzz",3,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c5bc;
    pfStack_4f10 = (fdb_config *)0x11c50b;
    fVar4 = fdb_iterator_get(pfStack_4ef8,&pfStack_4ee8);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c1;
    pfStack_4f10 = (fdb_config *)0x11c51e;
    fVar4 = fdb_iterator_seek_to_max(pfStack_4ef8);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c6;
    pfStack_4f10 = (fdb_config *)0x11c531;
    fVar4 = fdb_close(pfStack_4ee0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c5cb;
    pfStack_4f10 = (fdb_config *)0x11c53e;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4f10 = (fdb_config *)0x11c54b;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_4f10 = (fdb_config *)0x11c57c;
      fprintf(_stderr,pcVar21,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_4f10 = (fdb_config *)0x11c58c;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c58c:
    pfStack_4f10 = (fdb_config *)0x11c593;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c593:
    pfStack_4f10 = (fdb_config *)0x11c598;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c598:
    pfStack_4f10 = (fdb_config *)0x11c59f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c59f:
    pfStack_4f10 = (fdb_config *)0x11c5a6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5a6:
    pfStack_4f10 = (fdb_config *)0x11c5ae;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5ae:
    pfStack_4f10 = (fdb_config *)0x11c5b5;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5b5:
    pfStack_4f10 = (fdb_config *)0x11c5bc;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5bc:
    pfStack_4f10 = (fdb_config *)0x11c5c1;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c1:
    pfStack_4f10 = (fdb_config *)0x11c5c6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c6:
    pfStack_4f10 = (fdb_config *)0x11c5cb;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5cb:
    pfStack_4f10 = (fdb_config *)0x11c5d2;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_4f10 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_4f10 = pfVar17;
  gettimeofday(&tStack_5018,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_5050 = (fdb_iterator *)0x0;
  pfStack_5038 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar4 = fdb_open(&pfStack_5040,"./iterator_test1",&fStack_5008);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fVar4 = fdb_kvs_open_default(pfStack_5040,&pfStack_5048,&fStack_5030);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c779;
    fdb_set_kv(pfStack_5048,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_5048,"C",1,(void *)0x0,0);
    fVar4 = fdb_del_kv(pfStack_5048,"B",1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c780;
    fVar4 = fdb_iterator_init(pfStack_5048,&pfStack_5050,"A",1,"B",1,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c787;
    fVar4 = fdb_iterator_get(pfStack_5050,&pfStack_5038);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c78c;
    fVar4 = fdb_iterator_seek_to_min(pfStack_5050);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c791;
    fVar4 = fdb_iterator_close(pfStack_5050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c796;
    fVar4 = fdb_close(pfStack_5040);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fVar4 = fdb_shutdown();
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar21,"iterator seek to min test");
        return;
      }
      goto LAB_0011c7a4;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c779:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c780:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c787:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c78c:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c791:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c796:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c7a4:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar5 = 0;
  do {
    iVar20 = 0;
    do {
      iterator_complete_test(iVar5,iVar20);
      iVar20 = iVar20 + 1;
    } while (iVar20 == 1);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void reverse_sequence_iterator_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, r, count;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc **doc2 = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_iterator *iterator2;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &kv1, &kvs_config);
    status = fdb_set_log_callback(kv1, logCallbackFunc,
                                  (void *) "reverse_sequence_iterator_kvs_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store...
    status = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // to 'kv2' with entire range
    for (i=0;i<n;++i) {
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc2[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv2, doc2[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // insert kv1 documents of even number
    for (i=0;i<n;i+=2) {
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv1, doc[i]);
    }

    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert kv1 documents of odd number
    for (i=1;i<n;i+=2) {
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv1, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // iterate even docs on kv1
    status = fdb_iterator_sequence_init(kv1, &iterator, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=0;
    count = 0;
    while (1) {
        fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
        if (i + 2 >= n) {
            break;
        }
        i = i + 2; // by-seq, first come even docs, then odd
        status = fdb_iterator_next(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) break;
    }
    TEST_CHK(count==n/2);

    // iterate all docs over kv2
    status = fdb_iterator_sequence_init(kv2, &iterator2, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    while(1) {
        status = fdb_iterator_get(iterator2, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        status = fdb_iterator_next(iterator2);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
    }

    // manually flush WAL & commit
    // iterators should be unaffected
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // reverse iterate even docs over kv1
     i = n - 4;
    count = 0;
    while (1) {
        status = fdb_iterator_prev(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i-=2;
        count++;
    }

    TEST_CHK(count==4);
    fdb_iterator_close(iterator);

    i = n-1;
    count = 0;
    // reverse iterate all docs over kv2
    while (1) {
        status = fdb_iterator_prev(iterator2);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
        status = fdb_iterator_get(iterator2, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc2[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i--;
        count++;
    }
    TEST_CHK(count==n);
    fdb_iterator_close(iterator2);

    // re-open iterator after commit should return all docs for kv1
    i = 0;
    count = 0;
    status = fdb_iterator_sequence_init(kv1, &iterator, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    while (1) {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        if (i == 8) {
            i=1; // switch to odds
        } else {
            i+=2;
        }
        count++;
        status = fdb_iterator_next(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
    }
    TEST_CHK(count==n);
    fdb_iterator_close(iterator);

    // free all documents
    for (i=0;i<n;++i) {
        fdb_doc_free(doc[i]);
        fdb_doc_free(doc2[i]);
    }

    fdb_kvs_close(kv1);
    fdb_kvs_close(kv2);
    fdb_close(dbfile);

    fdb_shutdown();
    memleak_end();
    TEST_RESULT("reverse sequence iterator kvs test");

}